

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O3

string * __thiscall
RegressionTree::genVarianceComputation_abi_cxx11_
          (string *__return_storage_ptr__,RegressionTree *this)

{
  var_bitset *this_00;
  var_bitset *this_01;
  Query *pQVar1;
  pointer ppAVar2;
  Query *pQVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  bool bVar8;
  size_t sVar9;
  long *plVar10;
  undefined8 *puVar11;
  Attribute *pAVar12;
  ulong *puVar13;
  View *pVVar14;
  ulong *puVar15;
  ulong *puVar16;
  size_type *psVar17;
  long *plVar18;
  ulong uVar19;
  pointer pQVar20;
  ulong uVar21;
  ulong *puVar22;
  char cVar23;
  undefined8 uVar24;
  ulong uVar25;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar26;
  string __str_26;
  string thresholdStruct;
  string __str_28;
  string __str_5;
  string numOfThresholds;
  string functionIndex;
  string __str;
  string __str_6;
  string __str_4;
  string __str_1;
  string __str_2;
  string contVariance;
  string __str_3;
  string computeVariance;
  string categVariance;
  string initVariance;
  string contFunctionIndex;
  string categFunctionIndex;
  string __str_10;
  string __str_22;
  string __str_8;
  string __str_13;
  string __str_12;
  string __str_9;
  string __str_16;
  string __str_15;
  string __str_17;
  string __str_11;
  string __str_14;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  variancePerView;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  functionPerView;
  vector<Query_*,_std::allocator<Query_*>_> complementQueryPerView;
  ulong *local_860;
  long local_858;
  ulong local_850;
  long lStack_848;
  ulong *local_840;
  long local_838;
  ulong local_830;
  long lStack_828;
  ulong *local_820;
  long local_818;
  ulong local_810;
  long lStack_808;
  ulong *local_800;
  long local_7f8;
  ulong local_7f0;
  long lStack_7e8;
  ulong *local_7e0;
  long local_7d8;
  ulong local_7d0;
  long lStack_7c8;
  ulong *local_7c0;
  long local_7b8;
  ulong local_7b0;
  long lStack_7a8;
  ulong *local_7a0;
  long local_798;
  ulong local_790;
  long lStack_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  ulong *local_760;
  long local_758;
  ulong local_750;
  long lStack_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  ulong *local_720;
  long local_718;
  ulong local_710;
  long lStack_708;
  ulong *local_700;
  long local_6f8;
  ulong local_6f0;
  long lStack_6e8;
  ulong *local_6e0;
  long local_6d8;
  ulong local_6d0;
  long lStack_6c8;
  ulong *local_6c0;
  long local_6b8;
  ulong local_6b0;
  undefined8 uStack_6a8;
  ulong *local_6a0;
  long local_698;
  ulong local_690;
  long lStack_688;
  long *local_680;
  long local_678;
  long local_670;
  long lStack_668;
  ulong *local_660;
  long local_658;
  ulong local_650;
  long lStack_648;
  ulong *local_640;
  long local_638;
  ulong local_630;
  long lStack_628;
  ulong *local_620;
  long local_618;
  ulong local_610;
  long lStack_608;
  ulong *local_600;
  long local_5f8;
  ulong local_5f0;
  long lStack_5e8;
  ulong *local_5e0;
  long local_5d8;
  ulong local_5d0;
  long lStack_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  ulong *local_5a0;
  long local_598;
  ulong local_590;
  long lStack_588;
  ulong *local_580;
  long local_578;
  ulong local_570;
  undefined8 uStack_568;
  ulong *local_560;
  long local_558;
  ulong local_550;
  long lStack_548;
  ulong *local_540;
  long local_538;
  ulong local_530;
  long lStack_528;
  ulong *local_520;
  long local_518;
  ulong local_510;
  long lStack_508;
  ulong *local_500;
  long local_4f8;
  ulong local_4f0;
  long lStack_4e8;
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0;
  long lStack_4c8;
  ulong *local_4c0;
  long local_4b8;
  ulong local_4b0;
  long lStack_4a8;
  ulong *local_4a0;
  long local_498;
  ulong local_490;
  long lStack_488;
  ulong *local_480;
  long local_478;
  ulong local_470;
  long lStack_468;
  ulong *local_460;
  long local_458;
  ulong local_450;
  long lStack_448;
  ulong *local_440;
  long local_438;
  ulong local_430;
  long lStack_428;
  ulong *local_420;
  long local_418;
  ulong local_410;
  long lStack_408;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  long lStack_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  long lStack_3c8;
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0;
  long lStack_3a8;
  ulong *local_3a0;
  long local_398;
  ulong local_390;
  long lStack_388;
  ulong *local_380;
  ulong *local_378;
  long local_370;
  ulong local_368;
  long lStack_360;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  ulong *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  ulong *local_310;
  long local_308;
  ulong local_300;
  undefined8 uStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  undefined8 uStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  uint local_288;
  undefined4 uStack_284;
  ulong local_280 [2];
  ulong *local_270;
  uint local_268;
  undefined4 uStack_264;
  ulong local_260 [2];
  ulong *local_250;
  uint local_248;
  undefined4 uStack_244;
  ulong local_240 [2];
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  uint local_208;
  undefined4 uStack_204;
  ulong local_200 [2];
  RegressionTree *local_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  ulong *local_1a8;
  long local_1a0;
  ulong local_198 [2];
  ulong *local_188;
  long local_180;
  ulong local_178 [2];
  ulong *local_168;
  long local_160;
  ulong local_158 [2];
  ulong *local_148;
  long local_140;
  ulong local_138 [2];
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  ulong *local_108;
  ulong *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  void *local_d8;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_d0;
  string *local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_70;
  ulong *local_58;
  pointer local_50;
  vector<Query_*,_std::allocator<Query_*>_> local_48;
  
  local_b8 = __return_storage_ptr__;
  sVar9 = QueryCompiler::numberOfViews
                    ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_d0,sVar9,(allocator_type *)&local_780);
  local_1f0 = this;
  sVar9 = QueryCompiler::numberOfViews
                    ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_70,sVar9,(allocator_type *)&local_780);
  local_d8 = operator_new(800);
  memset(local_d8,0,800);
  sVar9 = QueryCompiler::numberOfViews
                    ((local_1f0->_compiler).
                     super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<Query_*,_std::allocator<Query_*>_>::vector
            (&local_48,sVar9,(allocator_type *)&local_780);
  local_50 = queryToThreshold.
             super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pQVar20 = queryToThreshold.
            super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (queryToThreshold.super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      queryToThreshold.super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pQVar1 = pQVar20->query;
      ppAVar2 = (pQVar1->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_338 = *(ulong **)
                   &((*ppAVar2)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl;
      puVar22 = *(ulong **)
                 &(ppAVar2[1]->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl;
      puVar13 = *(ulong **)
                 &(ppAVar2[2]->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl;
      if (((local_1f0->_categoricalFeatures).super__Base_bitset<2UL>._M_w[pQVar20->varID >> 6] >>
           (pQVar20->varID & 0x3f) & 1) == 0) {
        local_100 = *(ulong **)
                     &(ppAVar2[3]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
        uVar25 = *local_338;
        if ((((uVar25 != *puVar22) || (uVar25 != *puVar13)) || (*local_100 != uVar25)) ||
           ((puVar15 = *(ulong **)
                        &(ppAVar2[4]->_incoming).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl, *puVar15 != uVar25 ||
            (puVar16 = *(ulong **)
                        &(ppAVar2[5]->_incoming).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl, local_380 = local_338, local_108 = local_100, *puVar16 != uVar25)
            ))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"THERE IS AN ERROR IN genVarianceComputation",0x2b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          ppAVar2 = (pQVar1->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_380 = *(ulong **)
                       &((*ppAVar2)->_incoming).
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl;
          puVar22 = *(ulong **)
                     &(ppAVar2[1]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
          puVar13 = *(ulong **)
                     &(ppAVar2[2]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
          local_108 = *(ulong **)
                       &(ppAVar2[3]->_incoming).
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl;
          puVar15 = *(ulong **)
                     &(ppAVar2[4]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
          puVar16 = *(ulong **)
                     &(ppAVar2[5]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
          uVar25 = *local_338;
        }
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016c330;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016c330;
            }
            if (uVar21 < 10000) goto LAB_0016c330;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016c330:
        local_680 = &local_670;
        local_58 = puVar16;
        std::__cxx11::string::_M_construct((ulong)&local_680,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar25);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_680,0,(char *)0x0,0x2a5219);
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0.field_2._8_8_ = plVar10[3];
          local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_5c0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_5c0);
        psVar17 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_780.field_2._M_allocated_capacity = *psVar17;
          local_780.field_2._8_8_ = puVar11[3];
          local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
        }
        else {
          local_780.field_2._M_allocated_capacity = *psVar17;
          local_780._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_780._M_string_length = puVar11[1];
        *puVar11 = psVar17;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        puVar16 = local_338;
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        pvVar26 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_d0.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *puVar16);
        std::operator+(&local_330,"((",&local_780);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_330);
        local_660 = &local_650;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_650 = *puVar16;
          lStack_648 = plVar10[3];
        }
        else {
          local_650 = *puVar16;
          local_660 = (ulong *)*plVar10;
        }
        local_658 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = local_380[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016c574;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016c574;
            }
            if (uVar21 < 10000) goto LAB_0016c574;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016c574:
        local_378 = &local_368;
        std::__cxx11::string::_M_construct((ulong)&local_378,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_378,(uint)local_370,uVar25);
        uVar25 = 0xf;
        if (local_660 != &local_650) {
          uVar25 = local_650;
        }
        if (uVar25 < (ulong)(local_370 + local_658)) {
          uVar25 = 0xf;
          if (local_378 != &local_368) {
            uVar25 = local_368;
          }
          if (uVar25 < (ulong)(local_370 + local_658)) goto LAB_0016c60e;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_660);
        }
        else {
LAB_0016c60e:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_378);
        }
        local_640 = &local_630;
        puVar16 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar16) {
          local_630 = *puVar16;
          lStack_628 = puVar11[3];
        }
        else {
          local_630 = *puVar16;
          local_640 = (ulong *)*puVar11;
        }
        local_638 = puVar11[1];
        *puVar11 = puVar16;
        puVar11[1] = 0;
        *(undefined1 *)puVar16 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_640);
        local_440 = &local_430;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_430 = *puVar16;
          lStack_428 = plVar10[3];
        }
        else {
          local_430 = *puVar16;
          local_440 = (ulong *)*plVar10;
        }
        local_438 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_440,(ulong)local_780._M_dataplus._M_p);
        local_420 = &local_410;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_410 = *puVar16;
          lStack_408 = plVar10[3];
        }
        else {
          local_410 = *puVar16;
          local_420 = (ulong *)*plVar10;
        }
        local_418 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
        local_5a0 = &local_590;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_590 = *puVar16;
          lStack_588 = plVar10[3];
        }
        else {
          local_590 = *puVar16;
          local_5a0 = (ulong *)*plVar10;
        }
        local_598 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = local_108[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016c82f;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016c82f;
            }
            if (uVar21 < 10000) goto LAB_0016c82f;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016c82f:
        local_2b0 = &local_2a0;
        std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b0,(uint)local_2a8,uVar25);
        uVar25 = 0xf;
        if (local_5a0 != &local_590) {
          uVar25 = local_590;
        }
        if (uVar25 < (ulong)(local_2a8 + local_598)) {
          uVar25 = 0xf;
          if (local_2b0 != &local_2a0) {
            uVar25 = local_2a0;
          }
          if (uVar25 < (ulong)(local_2a8 + local_598)) goto LAB_0016c8c9;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_5a0);
        }
        else {
LAB_0016c8c9:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_2b0);
        }
        local_6c0 = &local_6b0;
        puVar16 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar16) {
          local_6b0 = *puVar16;
          uStack_6a8 = puVar11[3];
        }
        else {
          local_6b0 = *puVar16;
          local_6c0 = (ulong *)*puVar11;
        }
        local_6b8 = puVar11[1];
        *puVar11 = puVar16;
        puVar11[1] = 0;
        *(undefined1 *)puVar16 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_6c0);
        local_580 = &local_570;
        puVar16 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar16) {
          local_570 = *puVar16;
          uStack_568 = puVar11[3];
        }
        else {
          local_570 = *puVar16;
          local_580 = (ulong *)*puVar11;
        }
        local_578 = puVar11[1];
        *puVar11 = puVar16;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_580,(ulong)local_780._M_dataplus._M_p);
        local_540 = &local_530;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_530 = *puVar16;
          lStack_528 = plVar10[3];
        }
        else {
          local_530 = *puVar16;
          local_540 = (ulong *)*plVar10;
        }
        local_538 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_540);
        local_310 = &local_300;
        puVar16 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar16) {
          local_300 = *puVar16;
          uStack_2f8 = puVar11[3];
        }
        else {
          local_300 = *puVar16;
          local_310 = (ulong *)*puVar11;
        }
        local_308 = puVar11[1];
        *puVar11 = puVar16;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        uVar25 = puVar13[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016caea;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016caea;
            }
            if (uVar21 < 10000) goto LAB_0016caea;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016caea:
        local_4a0 = &local_490;
        std::__cxx11::string::_M_construct((ulong)&local_4a0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_4a0,(uint)local_498,uVar25);
        uVar25 = 0xf;
        if (local_310 != &local_300) {
          uVar25 = local_300;
        }
        if (uVar25 < (ulong)(local_498 + local_308)) {
          uVar25 = 0xf;
          if (local_4a0 != &local_490) {
            uVar25 = local_490;
          }
          if (uVar25 < (ulong)(local_498 + local_308)) goto LAB_0016cb84;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,(ulong)local_310);
        }
        else {
LAB_0016cb84:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_4a0);
        }
        local_520 = &local_510;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_510 = *puVar13;
          lStack_508 = puVar11[3];
        }
        else {
          local_510 = *puVar13;
          local_520 = (ulong *)*puVar11;
        }
        local_518 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
        local_3a0 = &local_390;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_390 = *puVar13;
          lStack_388 = plVar10[3];
        }
        else {
          local_390 = *puVar13;
          local_3a0 = (ulong *)*plVar10;
        }
        local_398 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_3a0,(ulong)local_780._M_dataplus._M_p);
        local_3c0 = &local_3b0;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_3b0 = *puVar13;
          lStack_3a8 = plVar10[3];
        }
        else {
          local_3b0 = *puVar13;
          local_3c0 = (ulong *)*plVar10;
        }
        local_3b8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        local_358 = &local_348;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_348 = *puVar13;
          lStack_340 = plVar10[3];
        }
        else {
          local_348 = *puVar13;
          local_358 = (ulong *)*plVar10;
        }
        local_350 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = puVar22[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016cd9e;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016cd9e;
            }
            if (uVar21 < 10000) goto LAB_0016cd9e;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016cd9e:
        local_230 = &local_220;
        std::__cxx11::string::_M_construct((ulong)&local_230,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_230,(uint)local_228,uVar25);
        uVar25 = 0xf;
        if (local_358 != &local_348) {
          uVar25 = local_348;
        }
        if (uVar25 < (ulong)(local_228 + local_350)) {
          uVar25 = 0xf;
          if (local_230 != &local_220) {
            uVar25 = local_220;
          }
          if (uVar25 < (ulong)(local_228 + local_350)) goto LAB_0016ce38;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_0016ce38:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_230);
        }
        local_480 = &local_470;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_470 = *puVar13;
          lStack_468 = puVar11[3];
        }
        else {
          local_470 = *puVar13;
          local_480 = (ulong *)*puVar11;
        }
        local_478 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
        local_560 = &local_550;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_550 = *puVar13;
          lStack_548 = puVar11[3];
        }
        else {
          local_550 = *puVar13;
          local_560 = (ulong *)*puVar11;
        }
        local_558 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_560,(ulong)local_780._M_dataplus._M_p);
        local_400 = &local_3f0;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_3f0 = *puVar13;
          lStack_3e8 = plVar10[3];
        }
        else {
          local_3f0 = *puVar13;
          local_400 = (ulong *)*plVar10;
        }
        local_3f8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
        local_4e0 = &local_4d0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_4d0 = *puVar13;
          lStack_4c8 = puVar11[3];
        }
        else {
          local_4d0 = *puVar13;
          local_4e0 = (ulong *)*puVar11;
        }
        local_4d8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        uVar25 = puVar22[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016d05a;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016d05a;
            }
            if (uVar21 < 10000) goto LAB_0016d05a;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016d05a:
        local_2d0 = &local_2c0;
        std::__cxx11::string::_M_construct((ulong)&local_2d0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2d0,(uint)local_2c8,uVar25);
        uVar25 = 0xf;
        if (local_4e0 != &local_4d0) {
          uVar25 = local_4d0;
        }
        if (uVar25 < (ulong)(local_2c8 + local_4d8)) {
          uVar25 = 0xf;
          if (local_2d0 != &local_2c0) {
            uVar25 = local_2c0;
          }
          if (uVar25 < (ulong)(local_2c8 + local_4d8)) goto LAB_0016d0f4;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_4e0);
        }
        else {
LAB_0016d0f4:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_2d0);
        }
        local_3e0 = &local_3d0;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_3d0 = *puVar22;
          lStack_3c8 = puVar11[3];
        }
        else {
          local_3d0 = *puVar22;
          local_3e0 = (ulong *)*puVar11;
        }
        local_3d8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        local_460 = &local_450;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_450 = *puVar22;
          lStack_448 = plVar10[3];
        }
        else {
          local_450 = *puVar22;
          local_460 = (ulong *)*plVar10;
        }
        local_458 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_460,(ulong)local_780._M_dataplus._M_p);
        local_620 = &local_610;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_610 = *puVar22;
          lStack_608 = plVar10[3];
        }
        else {
          local_610 = *puVar22;
          local_620 = (ulong *)*plVar10;
        }
        local_618 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_620);
        local_6a0 = &local_690;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_690 = *puVar22;
          lStack_688 = plVar10[3];
        }
        else {
          local_690 = *puVar22;
          local_6a0 = (ulong *)*plVar10;
        }
        local_698 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = local_380[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016d315;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016d315;
            }
            if (uVar21 < 10000) goto LAB_0016d315;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016d315:
        local_2f0 = &local_2e0;
        std::__cxx11::string::_M_construct((ulong)&local_2f0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f0,(uint)local_2e8,uVar25);
        uVar25 = 0xf;
        if (local_6a0 != &local_690) {
          uVar25 = local_690;
        }
        if (uVar25 < (ulong)(local_2e8 + local_698)) {
          uVar25 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar25 = local_2e0;
          }
          if (uVar25 < (ulong)(local_2e8 + local_698)) goto LAB_0016d3b7;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_6a0);
        }
        else {
LAB_0016d3b7:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_2f0);
        }
        local_6e0 = &local_6d0;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_6d0 = *puVar22;
          lStack_6c8 = puVar11[3];
        }
        else {
          local_6d0 = *puVar22;
          local_6e0 = (ulong *)*puVar11;
        }
        local_6d8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_6e0);
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_740.field_2._M_allocated_capacity = *puVar22;
          local_740.field_2._8_8_ = plVar10[3];
        }
        else {
          local_740.field_2._M_allocated_capacity = *puVar22;
          local_740._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_740._M_string_length = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_740,(ulong)local_780._M_dataplus._M_p);
        local_720 = &local_710;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_710 = *puVar22;
          lStack_708 = plVar10[3];
        }
        else {
          local_710 = *puVar22;
          local_720 = (ulong *)*plVar10;
        }
        local_718 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_720);
        local_7a0 = &local_790;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_790 = *puVar22;
          lStack_788 = plVar10[3];
        }
        else {
          local_790 = *puVar22;
          local_7a0 = (ulong *)*plVar10;
        }
        local_798 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = local_58[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016d5d3;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016d5d3;
            }
            if (uVar21 < 10000) goto LAB_0016d5d3;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016d5d3:
        local_210 = local_200;
        std::__cxx11::string::_M_construct((ulong)&local_210,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_210,local_208,uVar25);
        uVar25 = 0xf;
        if (local_7a0 != &local_790) {
          uVar25 = local_790;
        }
        uVar21 = CONCAT44(uStack_204,local_208) + local_798;
        if (uVar25 < uVar21) {
          uVar25 = 0xf;
          if (local_210 != local_200) {
            uVar25 = local_200[0];
          }
          if (uVar25 < uVar21) goto LAB_0016d66d;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_7a0);
        }
        else {
LAB_0016d66d:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7a0,(ulong)local_210);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_6f0 = *puVar22;
          lStack_6e8 = puVar11[3];
          local_700 = &local_6f0;
        }
        else {
          local_6f0 = *puVar22;
          local_700 = (ulong *)*puVar11;
        }
        local_6f8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_700);
        local_7c0 = &local_7b0;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_7b0 = *puVar22;
          lStack_7a8 = plVar10[3];
        }
        else {
          local_7b0 = *puVar22;
          local_7c0 = (ulong *)*plVar10;
        }
        local_7b8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_7c0,(ulong)local_780._M_dataplus._M_p);
        local_820 = &local_810;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_810 = *puVar22;
          lStack_808 = plVar10[3];
        }
        else {
          local_810 = *puVar22;
          local_820 = (ulong *)*plVar10;
        }
        local_818 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_820);
        local_800 = &local_7f0;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_7f0 = *puVar22;
          lStack_7e8 = plVar10[3];
        }
        else {
          local_7f0 = *puVar22;
          local_800 = (ulong *)*plVar10;
        }
        local_7f8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = puVar15[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016d85a;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016d85a;
            }
            if (uVar21 < 10000) goto LAB_0016d85a;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016d85a:
        local_270 = local_260;
        std::__cxx11::string::_M_construct((ulong)&local_270,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_270,local_268,uVar25);
        uVar25 = 0xf;
        if (local_800 != &local_7f0) {
          uVar25 = local_7f0;
        }
        uVar21 = CONCAT44(uStack_264,local_268) + local_7f8;
        if (uVar25 < uVar21) {
          uVar25 = 0xf;
          if (local_270 != local_260) {
            uVar25 = local_260[0];
          }
          if (uVar25 < uVar21) goto LAB_0016d8f0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_800);
        }
        else {
LAB_0016d8f0:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_270);
        }
        local_840 = &local_830;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_830 = *puVar22;
          lStack_828 = puVar11[3];
        }
        else {
          local_830 = *puVar22;
          local_840 = (ulong *)*puVar11;
        }
        local_838 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_840);
        local_860 = &local_850;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_850 = *puVar22;
          lStack_848 = plVar10[3];
        }
        else {
          local_850 = *puVar22;
          local_860 = (ulong *)*plVar10;
        }
        local_858 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_860,(ulong)local_780._M_dataplus._M_p);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_7d0 = *puVar22;
          lStack_7c8 = plVar10[3];
          local_7e0 = &local_7d0;
        }
        else {
          local_7d0 = *puVar22;
          local_7e0 = (ulong *)*plVar10;
        }
        local_7d8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7e0);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_750 = *puVar22;
          lStack_748 = plVar10[3];
          local_760 = &local_750;
        }
        else {
          local_750 = *puVar22;
          local_760 = (ulong *)*plVar10;
        }
        local_758 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = puVar15[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016dae4;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016dae4;
            }
            if (uVar21 < 10000) goto LAB_0016dae4;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016dae4:
        local_290 = local_280;
        std::__cxx11::string::_M_construct((ulong)&local_290,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_290,local_288,uVar25);
        uVar25 = 0xf;
        if (local_760 != &local_750) {
          uVar25 = local_750;
        }
        uVar21 = CONCAT44(uStack_284,local_288) + local_758;
        if (uVar25 < uVar21) {
          uVar25 = 0xf;
          if (local_290 != local_280) {
            uVar25 = local_280[0];
          }
          if (uVar25 < uVar21) goto LAB_0016db86;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_760);
        }
        else {
LAB_0016db86:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_760,(ulong)local_290);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_5f0 = *puVar22;
          lStack_5e8 = puVar11[3];
          local_600 = &local_5f0;
        }
        else {
          local_5f0 = *puVar22;
          local_600 = (ulong *)*puVar11;
        }
        local_5f8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_600);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_4b0 = *puVar22;
          lStack_4a8 = plVar10[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0 = *puVar22;
          local_4c0 = (ulong *)*plVar10;
        }
        local_4b8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_4c0,(ulong)local_780._M_dataplus._M_p);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_4f0 = *puVar22;
          lStack_4e8 = plVar10[3];
          local_500 = &local_4f0;
        }
        else {
          local_4f0 = *puVar22;
          local_500 = (ulong *)*plVar10;
        }
        local_4f8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_500);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_5d0 = *puVar22;
          lStack_5c8 = plVar10[3];
          local_5e0 = &local_5d0;
        }
        else {
          local_5d0 = *puVar22;
          local_5e0 = (ulong *)*plVar10;
        }
        local_5d8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = local_108[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016dda3;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016dda3;
            }
            if (uVar21 < 10000) goto LAB_0016dda3;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016dda3:
        local_250 = local_240;
        std::__cxx11::string::_M_construct((ulong)&local_250,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_250,local_248,uVar25);
        uVar25 = 0xf;
        if (local_5e0 != &local_5d0) {
          uVar25 = local_5d0;
        }
        uVar21 = CONCAT44(uStack_244,local_248) + local_5d8;
        if (uVar25 < uVar21) {
          uVar25 = 0xf;
          if (local_250 != local_240) {
            uVar25 = local_240[0];
          }
          if (uVar25 < uVar21) goto LAB_0016de3d;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_5e0);
        }
        else {
LAB_0016de3d:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_250);
        }
        local_680 = &local_670;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_670 = *plVar10;
          lStack_668 = puVar11[3];
        }
        else {
          local_670 = *plVar10;
          local_680 = (long *)*puVar11;
        }
        local_678 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_680);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_5c0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar26,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_250 != local_240) {
          operator_delete(local_250);
        }
        if (local_5e0 != &local_5d0) {
          operator_delete(local_5e0);
        }
        if (local_500 != &local_4f0) {
          operator_delete(local_500);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_290 != local_280) {
          operator_delete(local_290);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_270 != local_260) {
          operator_delete(local_270);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_210 != local_200) {
          operator_delete(local_210);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_620 != &local_610) {
          operator_delete(local_620);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_560 != &local_550) {
          operator_delete(local_560);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_520 != &local_510) {
          operator_delete(local_520);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if (local_310 != &local_300) {
          operator_delete(local_310);
        }
        if (local_540 != &local_530) {
          operator_delete(local_540);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580);
        }
        if (local_6c0 != &local_6b0) {
          operator_delete(local_6c0);
        }
        puVar22 = local_338;
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0);
        }
        if (local_5a0 != &local_590) {
          operator_delete(local_5a0);
        }
        if (local_420 != &local_410) {
          operator_delete(local_420);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_660 != &local_650) {
          operator_delete(local_660);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p);
        }
        pvVar26 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_70.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *puVar22);
        uVar25 = pQVar20->varID;
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016e492;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016e492;
            }
            if (uVar21 < 10000) goto LAB_0016e492;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016e492:
        local_720 = &local_710;
        std::__cxx11::string::_M_construct((ulong)&local_720,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_720,(uint)local_718,uVar25);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_720,0,(char *)0x0,0x2a523d);
        puVar22 = local_338;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_790 = *puVar13;
          lStack_788 = plVar10[3];
          local_7a0 = &local_790;
        }
        else {
          local_790 = *puVar13;
          local_7a0 = (ulong *)*plVar10;
        }
        local_798 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7a0);
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_6f0 = *puVar13;
          lStack_6e8 = puVar11[3];
          local_700 = &local_6f0;
        }
        else {
          local_6f0 = *puVar13;
          local_700 = (ulong *)*puVar11;
        }
        local_6f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_740,vsnprintf,0x148,"%f",SUB84(*pQVar20->function->_parameter,0));
        uVar25 = 0xf;
        if (local_700 != &local_6f0) {
          uVar25 = local_6f0;
        }
        if (uVar25 < local_740._M_string_length + local_6f8) {
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar24 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_740._M_string_length + local_6f8) goto LAB_0016e62d;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_700);
        }
        else {
LAB_0016e62d:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_700,(ulong)local_740._M_dataplus._M_p);
        }
        local_7c0 = &local_7b0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7b0 = *puVar13;
          lStack_7a8 = puVar11[3];
        }
        else {
          local_7b0 = *puVar13;
          local_7c0 = (ulong *)*puVar11;
        }
        local_7b8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_810 = *puVar13;
          lStack_808 = puVar11[3];
        }
        else {
          local_810 = *puVar13;
          local_820 = (ulong *)*puVar11;
        }
        local_818 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_820);
        local_800 = &local_7f0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7f0 = *puVar13;
          lStack_7e8 = puVar11[3];
        }
        else {
          local_7f0 = *puVar13;
          local_800 = (ulong *)*puVar11;
        }
        local_7f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        uVar25 = *puVar22;
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016e7b2;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016e7b2;
            }
            if (uVar21 < 10000) goto LAB_0016e7b2;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016e7b2:
        local_6e0 = &local_6d0;
        std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6e0,(uint)local_6d8,uVar25);
        uVar25 = 0xf;
        if (local_800 != &local_7f0) {
          uVar25 = local_7f0;
        }
        if (uVar25 < (ulong)(local_6d8 + local_7f8)) {
          uVar25 = 0xf;
          if (local_6e0 != &local_6d0) {
            uVar25 = local_6d0;
          }
          if (uVar25 < (ulong)(local_6d8 + local_7f8)) goto LAB_0016e840;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6e0,0,(char *)0x0,(ulong)local_800);
        }
        else {
LAB_0016e840:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_6e0);
        }
        local_840 = &local_830;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_830 = *puVar22;
          lStack_828 = puVar11[3];
        }
        else {
          local_830 = *puVar22;
          local_840 = (ulong *)*puVar11;
        }
        local_838 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_840);
        local_860 = &local_850;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_850 = *puVar22;
          lStack_848 = puVar11[3];
        }
        else {
          local_850 = *puVar22;
          local_860 = (ulong *)*puVar11;
        }
        local_858 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        uVar25 = local_380[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016e962;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016e962;
            }
            if (uVar21 < 10000) goto LAB_0016e962;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016e962:
        local_6a0 = &local_690;
        std::__cxx11::string::_M_construct((ulong)&local_6a0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6a0,(uint)local_698,uVar25);
        uVar25 = 0xf;
        if (local_860 != &local_850) {
          uVar25 = local_850;
        }
        if (uVar25 < (ulong)(local_698 + local_858)) {
          uVar25 = 0xf;
          if (local_6a0 != &local_690) {
            uVar25 = local_690;
          }
          if (uVar25 < (ulong)(local_698 + local_858)) goto LAB_0016e9f8;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6a0,0,(char *)0x0,(ulong)local_860);
        }
        else {
LAB_0016e9f8:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_6a0);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_7d0 = *puVar22;
          lStack_7c8 = puVar11[3];
          local_7e0 = &local_7d0;
        }
        else {
          local_7d0 = *puVar22;
          local_7e0 = (ulong *)*puVar11;
        }
        local_7d8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_750 = *puVar22;
          lStack_748 = puVar11[3];
          local_760 = &local_750;
        }
        else {
          local_750 = *puVar22;
          local_760 = (ulong *)*puVar11;
        }
        local_758 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_760);
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_5f0 = *puVar22;
          lStack_5e8 = puVar11[3];
          local_600 = &local_5f0;
        }
        else {
          local_5f0 = *puVar22;
          local_600 = (ulong *)*puVar11;
        }
        local_5f8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        uVar25 = *local_100;
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016eb9e;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016eb9e;
            }
            if (uVar21 < 10000) goto LAB_0016eb9e;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016eb9e:
        local_620 = &local_610;
        std::__cxx11::string::_M_construct((ulong)&local_620,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_620,(uint)local_618,uVar25);
        uVar25 = 0xf;
        if (local_600 != &local_5f0) {
          uVar25 = local_5f0;
        }
        if (uVar25 < (ulong)(local_618 + local_5f8)) {
          uVar25 = 0xf;
          if (local_620 != &local_610) {
            uVar25 = local_610;
          }
          if (uVar25 < (ulong)(local_618 + local_5f8)) goto LAB_0016ec40;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_620,0,(char *)0x0,(ulong)local_600);
        }
        else {
LAB_0016ec40:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_620);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_4b0 = *puVar22;
          lStack_4a8 = puVar11[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0 = *puVar22;
          local_4c0 = (ulong *)*puVar11;
        }
        local_4b8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_4f0 = *puVar22;
          lStack_4e8 = puVar11[3];
          local_500 = &local_4f0;
        }
        else {
          local_4f0 = *puVar22;
          local_500 = (ulong *)*puVar11;
        }
        local_4f8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        uVar25 = local_108[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016ed80;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016ed80;
            }
            if (uVar21 < 10000) goto LAB_0016ed80;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016ed80:
        local_460 = &local_450;
        std::__cxx11::string::_M_construct((ulong)&local_460,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_460,(uint)local_458,uVar25);
        uVar25 = 0xf;
        if (local_500 != &local_4f0) {
          uVar25 = local_4f0;
        }
        if (uVar25 < (ulong)(local_458 + local_4f8)) {
          uVar25 = 0xf;
          if (local_460 != &local_450) {
            uVar25 = local_450;
          }
          if (uVar25 < (ulong)(local_458 + local_4f8)) goto LAB_0016ee22;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,(ulong)local_500);
        }
        else {
LAB_0016ee22:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_460);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_5d0 = *puVar22;
          lStack_5c8 = puVar11[3];
          local_5e0 = &local_5d0;
        }
        else {
          local_5d0 = *puVar22;
          local_5e0 = (ulong *)*puVar11;
        }
        local_5d8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_5e0);
        local_680 = &local_670;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_670 = *plVar10;
          lStack_668 = puVar11[3];
        }
        else {
          local_670 = *plVar10;
          local_680 = (long *)*puVar11;
        }
        local_678 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_680);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        psVar17 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_5c0._M_string_length = puVar11[1];
        *puVar11 = psVar17;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar26,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_5e0 != &local_5d0) {
          operator_delete(local_5e0);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_500 != &local_4f0) {
          operator_delete(local_500);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if (local_620 != &local_610) {
          operator_delete(local_620);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        puVar22 = local_720;
        if (local_720 != &local_710) goto LAB_0016c2fb;
      }
      else {
        pQVar3 = pQVar20->complementQuery;
        puVar15 = *(ulong **)
                   &((*(pQVar3->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
        uVar25 = *local_338;
        local_108 = puVar15;
        if ((uVar25 != *puVar22) || (local_380 = local_338, uVar25 != *puVar13)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"THERE IS AN ERROR IN genVarianceComputation",0x2b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          ppAVar2 = (pQVar1->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_380 = *(ulong **)
                       &((*ppAVar2)->_incoming).
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl;
          puVar22 = *(ulong **)
                     &(ppAVar2[1]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
          puVar13 = *(ulong **)
                     &(ppAVar2[2]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
          puVar15 = *(ulong **)
                     &((*(pQVar3->_aggregates).
                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data;
          uVar25 = *local_338;
        }
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016aa97;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016aa97;
            }
            if (uVar21 < 10000) goto LAB_0016aa97;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016aa97:
        local_680 = &local_670;
        local_100 = puVar15;
        std::__cxx11::string::_M_construct((ulong)&local_680,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar25);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_680,0,(char *)0x0,0x2a5219);
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0.field_2._8_8_ = plVar10[3];
          local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_5c0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_5c0);
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_780.field_2._M_allocated_capacity = *psVar17;
          local_780.field_2._8_8_ = plVar10[3];
          local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
        }
        else {
          local_780.field_2._M_allocated_capacity = *psVar17;
          local_780._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_780._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        puVar15 = local_338;
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        pvVar26 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_d0.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *puVar15);
        local_720 = &local_710;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_720,local_780._M_dataplus._M_p,
                   local_780._M_dataplus._M_p + local_780._M_string_length);
        std::__cxx11::string::append((char *)&local_720);
        uVar25 = puVar13[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016ac9a;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016ac9a;
            }
            if (uVar21 < 10000) goto LAB_0016ac9a;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016ac9a:
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_740,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_740._M_dataplus._M_p,(uint)local_740._M_string_length,uVar25);
        uVar25 = 0xf;
        if (local_720 != &local_710) {
          uVar25 = local_710;
        }
        if (uVar25 < local_740._M_string_length + local_718) {
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar24 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_740._M_string_length + local_718) goto LAB_0016ad3d;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_720);
        }
        else {
LAB_0016ad3d:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_720,(ulong)local_740._M_dataplus._M_p);
        }
        local_7a0 = &local_790;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_790 = *puVar13;
          lStack_788 = puVar11[3];
        }
        else {
          local_790 = *puVar13;
          local_7a0 = (ulong *)*puVar11;
        }
        local_798 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7a0);
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_6f0 = *puVar13;
          lStack_6e8 = puVar11[3];
          local_700 = &local_6f0;
        }
        else {
          local_6f0 = *puVar13;
          local_700 = (ulong *)*puVar11;
        }
        local_6f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_700,(ulong)local_780._M_dataplus._M_p);
        local_7c0 = &local_7b0;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_7b0 = *puVar13;
          lStack_7a8 = plVar10[3];
        }
        else {
          local_7b0 = *puVar13;
          local_7c0 = (ulong *)*plVar10;
        }
        local_7b8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_810 = *puVar13;
          lStack_808 = plVar10[3];
        }
        else {
          local_810 = *puVar13;
          local_820 = (ulong *)*plVar10;
        }
        local_818 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = puVar22[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016af3a;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016af3a;
            }
            if (uVar21 < 10000) goto LAB_0016af3a;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016af3a:
        local_6e0 = &local_6d0;
        std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6e0,(uint)local_6d8,uVar25);
        uVar25 = 0xf;
        if (local_820 != &local_810) {
          uVar25 = local_810;
        }
        if (uVar25 < (ulong)(local_6d8 + local_818)) {
          uVar25 = 0xf;
          if (local_6e0 != &local_6d0) {
            uVar25 = local_6d0;
          }
          if (uVar25 < (ulong)(local_6d8 + local_818)) goto LAB_0016afd0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6e0,0,(char *)0x0,(ulong)local_820);
        }
        else {
LAB_0016afd0:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_6e0);
        }
        local_800 = &local_7f0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7f0 = *puVar13;
          lStack_7e8 = puVar11[3];
        }
        else {
          local_7f0 = *puVar13;
          local_800 = (ulong *)*puVar11;
        }
        local_7f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_800);
        local_840 = &local_830;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_830 = *puVar13;
          lStack_828 = plVar10[3];
        }
        else {
          local_830 = *puVar13;
          local_840 = (ulong *)*plVar10;
        }
        local_838 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_840,(ulong)local_780._M_dataplus._M_p);
        local_860 = &local_850;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_850 = *puVar13;
          lStack_848 = plVar10[3];
        }
        else {
          local_850 = *puVar13;
          local_860 = (ulong *)*plVar10;
        }
        local_858 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_860);
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_7d0 = *puVar13;
          lStack_7c8 = plVar10[3];
          local_7e0 = &local_7d0;
        }
        else {
          local_7d0 = *puVar13;
          local_7e0 = (ulong *)*plVar10;
        }
        local_7d8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = puVar22[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016b1aa;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016b1aa;
            }
            if (uVar21 < 10000) goto LAB_0016b1aa;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016b1aa:
        local_6a0 = &local_690;
        std::__cxx11::string::_M_construct((ulong)&local_6a0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6a0,(uint)local_698,uVar25);
        uVar25 = 0xf;
        if (local_7e0 != &local_7d0) {
          uVar25 = local_7d0;
        }
        if (uVar25 < (ulong)(local_698 + local_7d8)) {
          uVar25 = 0xf;
          if (local_6a0 != &local_690) {
            uVar25 = local_690;
          }
          if (uVar25 < (ulong)(local_698 + local_7d8)) goto LAB_0016b24c;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6a0,0,(char *)0x0,(ulong)local_7e0);
        }
        else {
LAB_0016b24c:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7e0,(ulong)local_6a0);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_750 = *puVar22;
          lStack_748 = puVar11[3];
          local_760 = &local_750;
        }
        else {
          local_750 = *puVar22;
          local_760 = (ulong *)*puVar11;
        }
        local_758 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_760);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_5f0 = *puVar22;
          lStack_5e8 = plVar10[3];
          local_600 = &local_5f0;
        }
        else {
          local_5f0 = *puVar22;
          local_600 = (ulong *)*plVar10;
        }
        local_5f8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_600,(ulong)local_780._M_dataplus._M_p);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_4b0 = *puVar22;
          lStack_4a8 = plVar10[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0 = *puVar22;
          local_4c0 = (ulong *)*plVar10;
        }
        local_4b8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_4f0 = *puVar22;
          lStack_4e8 = plVar10[3];
          local_500 = &local_4f0;
        }
        else {
          local_4f0 = *puVar22;
          local_500 = (ulong *)*plVar10;
        }
        local_4f8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = local_380[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016b469;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016b469;
            }
            if (uVar21 < 10000) goto LAB_0016b469;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016b469:
        local_620 = &local_610;
        std::__cxx11::string::_M_construct((ulong)&local_620,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_620,(uint)local_618,uVar25);
        uVar25 = 0xf;
        if (local_500 != &local_4f0) {
          uVar25 = local_4f0;
        }
        if (uVar25 < (ulong)(local_618 + local_4f8)) {
          uVar25 = 0xf;
          if (local_620 != &local_610) {
            uVar25 = local_610;
          }
          if (uVar25 < (ulong)(local_618 + local_4f8)) goto LAB_0016b50b;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_620,0,(char *)0x0,(ulong)local_500);
        }
        else {
LAB_0016b50b:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_620);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_5d0 = *puVar22;
          lStack_5c8 = puVar11[3];
          local_5e0 = &local_5d0;
        }
        else {
          local_5d0 = *puVar22;
          local_5e0 = (ulong *)*puVar11;
        }
        local_5d8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_5e0);
        local_680 = &local_670;
        plVar18 = plVar10 + 2;
        if ((long *)*plVar10 == plVar18) {
          local_670 = *plVar18;
          lStack_668 = plVar10[3];
        }
        else {
          local_670 = *plVar18;
          local_680 = (long *)*plVar10;
        }
        local_678 = plVar10[1];
        *plVar10 = (long)plVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_680);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_5c0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar26,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_5e0 != &local_5d0) {
          operator_delete(local_5e0);
        }
        if (local_620 != &local_610) {
          operator_delete(local_620);
        }
        if (local_500 != &local_4f0) {
          operator_delete(local_500);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        puVar22 = local_338;
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
        super__Vector_impl_data._M_start[*puVar22] = pQVar3;
        pAVar12 = TreeDecomposition::getAttribute
                            ((local_1f0->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,pQVar20->varID);
        uVar25 = pQVar20->varID;
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016b8d5;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016b8d5;
            }
            if (uVar21 < 10000) goto LAB_0016b8d5;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016b8d5:
        pvVar26 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_70.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *local_338);
        local_700 = &local_6f0;
        std::__cxx11::string::_M_construct((ulong)&local_700,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_700,(uint)local_6f8,uVar25);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,0x2a523d);
        local_7c0 = &local_7b0;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_7b0 = *puVar22;
          lStack_7a8 = puVar11[3];
        }
        else {
          local_7b0 = *puVar22;
          local_7c0 = (ulong *)*puVar11;
        }
        local_7b8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_810 = *puVar22;
          lStack_808 = plVar10[3];
        }
        else {
          local_810 = *puVar22;
          local_820 = (ulong *)*plVar10;
        }
        local_818 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_820,(ulong)(pAVar12->_name)._M_dataplus._M_p);
        local_800 = &local_7f0;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_7f0 = *puVar22;
          lStack_7e8 = puVar11[3];
        }
        else {
          local_7f0 = *puVar22;
          local_800 = (ulong *)*puVar11;
        }
        local_7f8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
        local_840 = &local_830;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_830 = *puVar22;
          lStack_828 = puVar11[3];
        }
        else {
          local_830 = *puVar22;
          local_840 = (ulong *)*puVar11;
        }
        local_838 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_840);
        local_860 = &local_850;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_850 = *puVar22;
          lStack_848 = puVar11[3];
        }
        else {
          local_850 = *puVar22;
          local_860 = (ulong *)*puVar11;
        }
        local_858 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        uVar25 = local_380[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016bb65;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016bb65;
            }
            if (uVar21 < 10000) goto LAB_0016bb65;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016bb65:
        local_7a0 = &local_790;
        std::__cxx11::string::_M_construct((ulong)&local_7a0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_7a0,(uint)local_798,uVar25);
        uVar25 = 0xf;
        if (local_860 != &local_850) {
          uVar25 = local_850;
        }
        if (uVar25 < (ulong)(local_798 + local_858)) {
          uVar25 = 0xf;
          if (local_7a0 != &local_790) {
            uVar25 = local_790;
          }
          if (uVar25 < (ulong)(local_798 + local_858)) goto LAB_0016bbeb;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_7a0,0,(char *)0x0,(ulong)local_860);
        }
        else {
LAB_0016bbeb:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_7a0);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_7d0 = *puVar22;
          lStack_7c8 = puVar11[3];
          local_7e0 = &local_7d0;
        }
        else {
          local_7d0 = *puVar22;
          local_7e0 = (ulong *)*puVar11;
        }
        local_7d8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7e0);
        local_760 = &local_750;
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_750 = *puVar22;
          lStack_748 = plVar10[3];
        }
        else {
          local_750 = *puVar22;
          local_760 = (ulong *)*plVar10;
        }
        local_758 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_760);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_5f0 = *puVar22;
          lStack_5e8 = plVar10[3];
          local_600 = &local_5f0;
        }
        else {
          local_5f0 = *puVar22;
          local_600 = (ulong *)*plVar10;
        }
        local_5f8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = *local_108;
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016bd90;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016bd90;
            }
            if (uVar21 < 10000) goto LAB_0016bd90;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016bd90:
        local_720 = &local_710;
        std::__cxx11::string::_M_construct((ulong)&local_720,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_720,(uint)local_718,uVar25);
        uVar25 = 0xf;
        if (local_600 != &local_5f0) {
          uVar25 = local_5f0;
        }
        if (uVar25 < (ulong)(local_718 + local_5f8)) {
          uVar25 = 0xf;
          if (local_720 != &local_710) {
            uVar25 = local_710;
          }
          if (uVar25 < (ulong)(local_718 + local_5f8)) goto LAB_0016be32;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_720,0,(char *)0x0,(ulong)local_600);
        }
        else {
LAB_0016be32:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_720);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_4b0 = *puVar22;
          lStack_4a8 = puVar11[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0 = *puVar22;
          local_4c0 = (ulong *)*puVar11;
        }
        local_4b8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        puVar22 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar22) {
          local_4f0 = *puVar22;
          lStack_4e8 = plVar10[3];
          local_500 = &local_4f0;
        }
        else {
          local_4f0 = *puVar22;
          local_500 = (ulong *)*plVar10;
        }
        local_4f8 = plVar10[1];
        *plVar10 = (long)puVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = local_100[1];
        cVar23 = '\x01';
        if (9 < uVar25) {
          uVar21 = uVar25;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016bf72;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016bf72;
            }
            if (uVar21 < 10000) goto LAB_0016bf72;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016bf72:
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_740,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_740._M_dataplus._M_p,(uint)local_740._M_string_length,uVar25);
        uVar25 = 0xf;
        if (local_500 != &local_4f0) {
          uVar25 = local_4f0;
        }
        if (uVar25 < local_740._M_string_length + local_4f8) {
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar24 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_740._M_string_length + local_4f8) goto LAB_0016c014;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_500);
        }
        else {
LAB_0016c014:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_500,(ulong)local_740._M_dataplus._M_p);
        }
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_5d0 = *puVar22;
          lStack_5c8 = puVar11[3];
          local_5e0 = &local_5d0;
        }
        else {
          local_5d0 = *puVar22;
          local_5e0 = (ulong *)*puVar11;
        }
        local_5d8 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_5e0);
        local_680 = &local_670;
        plVar18 = plVar10 + 2;
        if ((long *)*plVar10 == plVar18) {
          local_670 = *plVar18;
          lStack_668 = plVar10[3];
        }
        else {
          local_670 = *plVar18;
          local_680 = (long *)*plVar10;
        }
        local_678 = plVar10[1];
        *plVar10 = (long)plVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_680);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_5c0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar26,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_5e0 != &local_5d0) {
          operator_delete(local_5e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_500 != &local_4f0) {
          operator_delete(local_500);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        puVar22 = local_700;
        if (local_700 != &local_6f0) {
LAB_0016c2fb:
          operator_delete(puVar22);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780._M_dataplus._M_p != &local_780.field_2) {
        operator_delete(local_780._M_dataplus._M_p);
      }
      pQVar20 = pQVar20 + 1;
    } while (pQVar20 != local_50);
  }
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"numberOfThresholds = ","");
  this_00 = &local_1f0->_features;
  this_01 = &local_1f0->_categoricalFeatures;
  uVar25 = 0;
  sVar9 = 0;
  do {
    bVar8 = std::bitset<100UL>::test(this_00,sVar9);
    if (bVar8) {
      bVar8 = std::bitset<100UL>::test(this_01,sVar9);
      if (bVar8) {
        uVar21 = **(ulong **)
                   &((*(local_1f0->_varToQueryMap[sVar9]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
        cVar23 = '\x01';
        if (9 < uVar21) {
          uVar19 = uVar21;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar19 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_0016f2a1;
            }
            if (uVar19 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_0016f2a1;
            }
            if (uVar19 < 10000) goto LAB_0016f2a1;
            bVar8 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0016f2a1:
        local_5e0 = &local_5d0;
        std::__cxx11::string::_M_construct((ulong)&local_5e0,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_5e0,(uint)local_5d8,uVar21);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_5e0,0,(char *)0x0,0x2a5219);
        local_680 = &local_670;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_670 = *plVar10;
          lStack_668 = puVar11[3];
        }
        else {
          local_670 = *plVar10;
          local_680 = (long *)*puVar11;
        }
        local_678 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_680);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        psVar17 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar17;
          local_5c0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_5c0._M_string_length = puVar11[1];
        *puVar11 = psVar17;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_780,(ulong)local_5c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_5e0 != &local_5d0) {
          operator_delete(local_5e0);
        }
      }
      else {
        *(ulong *)((long)local_d8 + sVar9 * 8) = uVar25;
        pvVar4 = (local_1f0->_thresholds).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = uVar25 + ((long)*(pointer *)
                                  ((long)&pvVar4[sVar9].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + 8) -
                           *(long *)&pvVar4[sVar9].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data >> 3);
      }
    }
    sVar9 = sVar9 + 1;
  } while (sVar9 != 100);
  cVar23 = '\x01';
  if (9 < uVar25) {
    uVar21 = uVar25;
    cVar7 = '\x04';
    do {
      cVar23 = cVar7;
      if (uVar21 < 100) {
        cVar23 = cVar23 + -2;
        goto LAB_0016f47d;
      }
      if (uVar21 < 1000) {
        cVar23 = cVar23 + -1;
        goto LAB_0016f47d;
      }
      if (uVar21 < 10000) goto LAB_0016f47d;
      bVar8 = 99999 < uVar21;
      uVar21 = uVar21 / 10000;
      cVar7 = cVar23 + '\x04';
    } while (bVar8);
    cVar23 = cVar23 + '\x01';
  }
LAB_0016f47d:
  local_680 = &local_670;
  std::__cxx11::string::_M_construct((ulong)&local_680,cVar23);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar25);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_680);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  psVar17 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_5c0.field_2._M_allocated_capacity = *psVar17;
    local_5c0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_5c0.field_2._M_allocated_capacity = *psVar17;
    local_5c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_5c0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_780,(ulong)local_5c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  local_500 = &local_4f0;
  std::__cxx11::string::_M_construct((ulong)&local_500,'\x06');
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_500,(ulong)local_780._M_dataplus._M_p);
  local_5e0 = &local_5d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_5d0 = *puVar22;
    lStack_5c8 = plVar10[3];
  }
  else {
    local_5d0 = *puVar22;
    local_5e0 = (ulong *)*plVar10;
  }
  local_5d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_4c0 = &local_4b0;
  std::__cxx11::string::_M_construct((ulong)&local_4c0,'\x06');
  uVar21 = 0xf;
  if (local_5e0 != &local_5d0) {
    uVar21 = local_5d0;
  }
  if (uVar21 < (ulong)(local_4b8 + local_5d8)) {
    uVar21 = 0xf;
    if (local_4c0 != &local_4b0) {
      uVar21 = local_4b0;
    }
    if (uVar21 < (ulong)(local_4b8 + local_5d8)) goto LAB_0016f67e;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4c0,0,(char *)0x0,(ulong)local_5e0);
  }
  else {
LAB_0016f67e:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_4c0);
  }
  local_680 = &local_670;
  plVar10 = puVar11 + 2;
  if ((long *)*puVar11 == plVar10) {
    local_670 = *plVar10;
    lStack_668 = puVar11[3];
  }
  else {
    local_670 = *plVar10;
    local_680 = (long *)*puVar11;
  }
  local_678 = puVar11[1];
  *puVar11 = plVar10;
  puVar11[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_680);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  psVar17 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_5c0.field_2._M_allocated_capacity = *psVar17;
    local_5c0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_5c0.field_2._M_allocated_capacity = *psVar17;
    local_5c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_5c0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_5e0 != &local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500);
  }
  local_680 = &local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"");
  local_5e0 = &local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"");
  local_500 = &local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"");
  local_4c0 = &local_4b0;
  local_380 = (ulong *)uVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"");
  puVar22 = (ulong *)0x0;
  uVar25 = 0;
  while( true ) {
    puVar13 = (ulong *)QueryCompiler::numberOfViews
                                 ((local_1f0->_compiler).
                                  super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
    if (puVar13 <= puVar22) break;
    if (local_d0.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d0.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cVar23 = '\x01';
      if ((ulong *)0x9 < puVar22) {
        puVar13 = puVar22;
        cVar7 = '\x04';
        do {
          cVar23 = cVar7;
          if (puVar13 < (ulong *)0x64) {
            cVar23 = cVar23 + -2;
            goto LAB_0016f8fd;
          }
          if (puVar13 < (ulong *)0x3e8) {
            cVar23 = cVar23 + -1;
            goto LAB_0016f8fd;
          }
          if (puVar13 < (ulong *)0x2710) goto LAB_0016f8fd;
          bVar8 = (ulong *)0x1869f < puVar13;
          puVar13 = (ulong *)((ulong)puVar13 / 10000);
          cVar7 = cVar23 + '\x04';
        } while (bVar8);
        cVar23 = cVar23 + '\x01';
      }
LAB_0016f8fd:
      local_760 = &local_750;
      std::__cxx11::string::_M_construct((ulong)&local_760,cVar23);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_760,(uint)local_758,(unsigned_long)puVar22);
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_760,0,(char *)0x0,0x2a5219);
      local_600 = &local_5f0;
      puVar13 = puVar11 + 2;
      if ((ulong *)*puVar11 == puVar13) {
        local_5f0 = *puVar13;
        lStack_5e8 = puVar11[3];
      }
      else {
        local_5f0 = *puVar13;
        local_600 = (ulong *)*puVar11;
      }
      local_5f8 = puVar11[1];
      *puVar11 = puVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      if (local_760 != &local_750) {
        operator_delete(local_760);
      }
      pVVar14 = QueryCompiler::getView
                          ((local_1f0->_compiler).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (size_t)puVar22);
      local_338 = puVar22;
      if ((pVVar14->_fVars).super__Base_bitset<2UL>._M_w[1] == 0 &&
          (pVVar14->_fVars).super__Base_bitset<2UL>._M_w[0] == 0) {
        local_7c0 = &local_7b0;
        std::__cxx11::string::_M_construct((ulong)&local_7c0,'\x06');
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_600)
        ;
        local_820 = &local_810;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_810 = *puVar13;
          lStack_808 = puVar11[3];
        }
        else {
          local_810 = *puVar13;
          local_820 = (ulong *)*puVar11;
        }
        local_818 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_820);
        local_800 = &local_7f0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7f0 = *puVar13;
          lStack_7e8 = puVar11[3];
        }
        else {
          local_7f0 = *puVar13;
          local_800 = (ulong *)*puVar11;
        }
        local_7f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_600)
        ;
        local_840 = &local_830;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_830 = *puVar13;
          lStack_828 = puVar11[3];
        }
        else {
          local_830 = *puVar13;
          local_840 = (ulong *)*puVar11;
        }
        local_838 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_840);
        local_860 = &local_850;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_850 = *puVar13;
          lStack_848 = puVar11[3];
        }
        else {
          local_850 = *puVar13;
          local_860 = (ulong *)*puVar11;
        }
        local_858 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_600)
        ;
        local_7e0 = &local_7d0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7d0 = *puVar13;
          lStack_7c8 = puVar11[3];
        }
        else {
          local_7d0 = *puVar13;
          local_7e0 = (ulong *)*puVar11;
        }
        local_7d8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_750 = *puVar13;
          lStack_748 = puVar11[3];
          local_760 = &local_750;
        }
        else {
          local_750 = *puVar13;
          local_760 = (ulong *)*puVar11;
        }
        local_758 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_680,(ulong)local_760);
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_d0.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_d0.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar21 = 0;
          do {
            local_800 = &local_7f0;
            std::__cxx11::string::_M_construct((ulong)&local_800,'\x06');
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_800);
            local_840 = &local_830;
            puVar13 = (ulong *)(plVar10 + 2);
            if ((ulong *)*plVar10 == puVar13) {
              local_830 = *puVar13;
              lStack_828 = plVar10[3];
            }
            else {
              local_830 = *puVar13;
              local_840 = (ulong *)*plVar10;
            }
            local_838 = plVar10[1];
            *plVar10 = (long)puVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            cVar23 = '\x01';
            if (9 < uVar25) {
              uVar19 = uVar25;
              cVar7 = '\x04';
              do {
                cVar23 = cVar7;
                if (uVar19 < 100) {
                  cVar23 = cVar23 + -2;
                  goto LAB_0016ff50;
                }
                if (uVar19 < 1000) {
                  cVar23 = cVar23 + -1;
                  goto LAB_0016ff50;
                }
                if (uVar19 < 10000) goto LAB_0016ff50;
                bVar8 = 99999 < uVar19;
                uVar19 = uVar19 / 10000;
                cVar7 = cVar23 + '\x04';
              } while (bVar8);
              cVar23 = cVar23 + '\x01';
            }
LAB_0016ff50:
            local_820 = &local_810;
            std::__cxx11::string::_M_construct((ulong)&local_820,cVar23);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_820,(uint)local_818,uVar25);
            uVar19 = 0xf;
            if (local_840 != &local_830) {
              uVar19 = local_830;
            }
            if (uVar19 < (ulong)(local_818 + local_838)) {
              uVar19 = 0xf;
              if (local_820 != &local_810) {
                uVar19 = local_810;
              }
              if (uVar19 < (ulong)(local_818 + local_838)) goto LAB_0016ffc1;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_820,0,(char *)0x0,(ulong)local_840);
            }
            else {
LAB_0016ffc1:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_820);
            }
            local_860 = &local_850;
            puVar13 = puVar11 + 2;
            if ((ulong *)*puVar11 == puVar13) {
              local_850 = *puVar13;
              lStack_848 = puVar11[3];
            }
            else {
              local_850 = *puVar13;
              local_860 = (ulong *)*puVar11;
            }
            local_858 = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)puVar13 = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_860);
            local_7e0 = &local_7d0;
            puVar13 = (ulong *)(plVar10 + 2);
            if ((ulong *)*plVar10 == puVar13) {
              local_7d0 = *puVar13;
              lStack_7c8 = plVar10[3];
            }
            else {
              local_7d0 = *puVar13;
              local_7e0 = (ulong *)*plVar10;
            }
            local_7d8 = plVar10[1];
            *plVar10 = (long)puVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_7e0,
                                         (ulong)local_d0.
                                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [(long)puVar22].
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                                _M_dataplus._M_p);
            local_760 = &local_750;
            puVar13 = (ulong *)(plVar10 + 2);
            if ((ulong *)*plVar10 == puVar13) {
              local_750 = *puVar13;
              lStack_748 = plVar10[3];
            }
            else {
              local_750 = *puVar13;
              local_760 = (ulong *)*plVar10;
            }
            local_758 = plVar10[1];
            *plVar10 = (long)puVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_680,(ulong)local_760);
            if (local_760 != &local_750) {
              operator_delete(local_760);
            }
            if (local_7e0 != &local_7d0) {
              operator_delete(local_7e0);
            }
            if (local_860 != &local_850) {
              operator_delete(local_860);
            }
            if (local_820 != &local_810) {
              operator_delete(local_820);
            }
            if (local_840 != &local_830) {
              operator_delete(local_840);
            }
            if (local_800 != &local_7f0) {
              operator_delete(local_800);
            }
            local_800 = &local_7f0;
            std::__cxx11::string::_M_construct((ulong)&local_800,'\x06');
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
            local_840 = &local_830;
            puVar13 = puVar11 + 2;
            if ((ulong *)*puVar11 == puVar13) {
              local_830 = *puVar13;
              lStack_828 = puVar11[3];
            }
            else {
              local_830 = *puVar13;
              local_840 = (ulong *)*puVar11;
            }
            local_838 = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            cVar23 = '\x01';
            if (9 < uVar25) {
              uVar19 = uVar25;
              cVar7 = '\x04';
              do {
                cVar23 = cVar7;
                if (uVar19 < 100) {
                  cVar23 = cVar23 + -2;
                  goto LAB_00170271;
                }
                if (uVar19 < 1000) {
                  cVar23 = cVar23 + -1;
                  goto LAB_00170271;
                }
                if (uVar19 < 10000) goto LAB_00170271;
                bVar8 = 99999 < uVar19;
                uVar19 = uVar19 / 10000;
                cVar7 = cVar23 + '\x04';
              } while (bVar8);
              cVar23 = cVar23 + '\x01';
            }
LAB_00170271:
            local_820 = &local_810;
            std::__cxx11::string::_M_construct((ulong)&local_820,cVar23);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_820,(uint)local_818,uVar25);
            uVar19 = 0xf;
            if (local_840 != &local_830) {
              uVar19 = local_830;
            }
            if (uVar19 < (ulong)(local_818 + local_838)) {
              uVar19 = 0xf;
              if (local_820 != &local_810) {
                uVar19 = local_810;
              }
              if (uVar19 < (ulong)(local_818 + local_838)) goto LAB_001702e2;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_820,0,(char *)0x0,(ulong)local_840);
            }
            else {
LAB_001702e2:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_820);
            }
            local_860 = &local_850;
            puVar13 = puVar11 + 2;
            if ((ulong *)*puVar11 == puVar13) {
              local_850 = *puVar13;
              lStack_848 = puVar11[3];
            }
            else {
              local_850 = *puVar13;
              local_860 = (ulong *)*puVar11;
            }
            local_858 = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)puVar13 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_860);
            local_7e0 = &local_7d0;
            puVar13 = puVar11 + 2;
            if ((ulong *)*puVar11 == puVar13) {
              local_7d0 = *puVar13;
              lStack_7c8 = puVar11[3];
            }
            else {
              local_7d0 = *puVar13;
              local_7e0 = (ulong *)*puVar11;
            }
            local_7d8 = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_7e0,
                                 (ulong)local_70.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                        _M_dataplus._M_p);
            puVar13 = puVar11 + 2;
            if ((ulong *)*puVar11 == puVar13) {
              local_750 = *puVar13;
              lStack_748 = puVar11[3];
              local_760 = &local_750;
            }
            else {
              local_750 = *puVar13;
              local_760 = (ulong *)*puVar11;
            }
            local_758 = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_760);
            if (local_760 != &local_750) {
              operator_delete(local_760);
            }
            if (local_7e0 != &local_7d0) {
              operator_delete(local_7e0);
            }
            if (local_860 != &local_850) {
              operator_delete(local_860);
            }
            if (local_820 != &local_810) {
              operator_delete(local_820);
            }
            if (local_840 != &local_830) {
              operator_delete(local_840);
            }
            if (local_800 != &local_7f0) {
              operator_delete(local_800);
            }
            uVar25 = uVar25 + 1;
            uVar21 = uVar21 + 1;
          } while (uVar21 < (ulong)((long)local_d0.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d0.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
      }
      else {
        if (0x20 < (ulong)((long)local_d0.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_d0.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::operator<<((ostream *)&std::cerr,"THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
LAB_00177b14:
          exit(1);
        }
        ppAVar2 = (local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)puVar22]->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar13 = *(ulong **)
                   &((*ppAVar2)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
        lVar5 = *(long *)(*(long *)&(ppAVar2[1]->_incoming).
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data + 8);
        if (((puVar13[1] != lVar5 - 1U) ||
            (lVar6 = *(long *)(*(long *)&(ppAVar2[2]->_incoming).
                                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data + 8),
            puVar13[1] != lVar6 - 2U)) || (lVar5 != lVar6 + -1)) {
          std::operator<<((ostream *)&std::cerr,
                          "We should have expected the aggregates to be contiguous!\n");
          goto LAB_00177b14;
        }
        local_210 = local_200;
        std::__cxx11::string::_M_construct((ulong)&local_210,'\x06');
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_210);
        puVar15 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar15) {
          local_2e0 = *puVar15;
          lStack_2d8 = plVar10[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = *puVar15;
          local_2f0 = (ulong *)*plVar10;
        }
        local_2e8 = plVar10[1];
        *plVar10 = (long)puVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar21 = *puVar13;
        cVar23 = '\x01';
        if (9 < uVar21) {
          uVar19 = uVar21;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar19 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_001704e9;
            }
            if (uVar19 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_001704e9;
            }
            if (uVar19 < 10000) goto LAB_001704e9;
            bVar8 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_001704e9:
        local_270 = local_260;
        std::__cxx11::string::_M_construct((ulong)&local_270,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_270,local_268,uVar21);
        uVar21 = 0xf;
        if (local_2f0 != &local_2e0) {
          uVar21 = local_2e0;
        }
        uVar19 = CONCAT44(uStack_264,local_268) + local_2e8;
        if (uVar21 < uVar19) {
          uVar21 = 0xf;
          if (local_270 != local_260) {
            uVar21 = local_260[0];
          }
          if (uVar21 < uVar19) goto LAB_0017058b;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
        }
        else {
LAB_0017058b:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270);
        }
        puVar15 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar15) {
          local_2c0 = *puVar15;
          uStack_2b8 = puVar11[3];
          local_2d0 = &local_2c0;
        }
        else {
          local_2c0 = *puVar15;
          local_2d0 = (ulong *)*puVar11;
        }
        local_2c8 = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)puVar15 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        puVar15 = local_338;
        local_230 = &local_220;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_220 = *puVar16;
          lStack_218 = plVar10[3];
        }
        else {
          local_220 = *puVar16;
          local_230 = (ulong *)*plVar10;
        }
        local_228 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar21 = puVar13[1];
        cVar23 = '\x01';
        if (9 < uVar21) {
          uVar19 = uVar21;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (uVar19 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_001706ca;
            }
            if (uVar19 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_001706ca;
            }
            if (uVar19 < 10000) goto LAB_001706ca;
            bVar8 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_001706ca:
        local_290 = local_280;
        std::__cxx11::string::_M_construct((ulong)&local_290,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_290,local_288,uVar21);
        uVar21 = 0xf;
        if (local_230 != &local_220) {
          uVar21 = local_220;
        }
        uVar19 = CONCAT44(uStack_284,local_288) + local_228;
        if (uVar21 < uVar19) {
          uVar21 = 0xf;
          if (local_290 != local_280) {
            uVar21 = local_280[0];
          }
          if (uVar21 < uVar19) goto LAB_0017076c;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_230);
        }
        else {
LAB_0017076c:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_290);
        }
        local_4a0 = &local_490;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_490 = *puVar13;
          lStack_488 = puVar11[3];
        }
        else {
          local_490 = *puVar13;
          local_4a0 = (ulong *)*puVar11;
        }
        local_498 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a0);
        local_2b0 = &local_2a0;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_2a0 = *puVar13;
          lStack_298 = plVar10[3];
        }
        else {
          local_2a0 = *puVar13;
          local_2b0 = (ulong *)*plVar10;
        }
        local_2a8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_250 = local_240;
        std::__cxx11::string::_M_construct((ulong)&local_250,'\x06');
        uVar21 = 0xf;
        if (local_2b0 != &local_2a0) {
          uVar21 = local_2a0;
        }
        uVar19 = CONCAT44(uStack_244,local_248) + local_2a8;
        if (uVar21 < uVar19) {
          uVar21 = 0xf;
          if (local_250 != local_240) {
            uVar21 = local_240[0];
          }
          if (uVar21 < uVar19) goto LAB_001708d5;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2b0);
        }
        else {
LAB_001708d5:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_250);
        }
        local_378 = &local_368;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_368 = *puVar13;
          lStack_360 = puVar11[3];
        }
        else {
          local_368 = *puVar13;
          local_378 = (ulong *)*puVar11;
        }
        local_370 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_378);
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_330.field_2._M_allocated_capacity = *psVar17;
          local_330.field_2._8_8_ = plVar10[3];
        }
        else {
          local_330.field_2._M_allocated_capacity = *psVar17;
          local_330._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_330._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_600)
        ;
        local_660 = &local_650;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_650 = *puVar13;
          lStack_648 = puVar11[3];
        }
        else {
          local_650 = *puVar13;
          local_660 = (ulong *)*puVar11;
        }
        local_658 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_660);
        local_640 = &local_630;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_630 = *puVar13;
          lStack_628 = puVar11[3];
        }
        else {
          local_630 = *puVar13;
          local_640 = (ulong *)*puVar11;
        }
        local_638 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_640,(ulong)local_600)
        ;
        local_440 = &local_430;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_430 = *puVar13;
          lStack_428 = puVar11[3];
        }
        else {
          local_430 = *puVar13;
          local_440 = (ulong *)*puVar11;
        }
        local_438 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
        local_420 = &local_410;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_410 = *puVar13;
          lStack_408 = puVar11[3];
        }
        else {
          local_410 = *puVar13;
          local_420 = (ulong *)*puVar11;
        }
        local_418 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_600)
        ;
        local_5a0 = &local_590;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_590 = *puVar13;
          lStack_588 = puVar11[3];
        }
        else {
          local_590 = *puVar13;
          local_5a0 = (ulong *)*puVar11;
        }
        local_598 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a0);
        local_6c0 = &local_6b0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_6b0 = *puVar13;
          uStack_6a8 = puVar11[3];
        }
        else {
          local_6b0 = *puVar13;
          local_6c0 = (ulong *)*puVar11;
        }
        local_6b8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_128 = local_118;
        std::__cxx11::string::_M_construct((ulong)&local_128,'\x06');
        uVar21 = 0xf;
        if (local_6c0 != &local_6b0) {
          uVar21 = local_6b0;
        }
        if (uVar21 < (ulong)(local_120 + local_6b8)) {
          uVar21 = 0xf;
          if (local_128 != local_118) {
            uVar21 = local_118[0];
          }
          if (uVar21 < (ulong)(local_120 + local_6b8)) goto LAB_00170ccf;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_6c0);
        }
        else {
LAB_00170ccf:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_128);
        }
        local_580 = &local_570;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_570 = *puVar13;
          uStack_568 = puVar11[3];
        }
        else {
          local_570 = *puVar13;
          local_580 = (ulong *)*puVar11;
        }
        local_578 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_580);
        local_540 = &local_530;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_530 = *puVar13;
          lStack_528 = puVar11[3];
        }
        else {
          local_530 = *puVar13;
          local_540 = (ulong *)*puVar11;
        }
        local_538 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_148 = local_138;
        std::__cxx11::string::_M_construct((ulong)&local_148,'\t');
        uVar21 = 0xf;
        if (local_540 != &local_530) {
          uVar21 = local_530;
        }
        if (uVar21 < (ulong)(local_140 + local_538)) {
          uVar21 = 0xf;
          if (local_148 != local_138) {
            uVar21 = local_138[0];
          }
          if (uVar21 < (ulong)(local_140 + local_538)) goto LAB_00170e38;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_540);
        }
        else {
LAB_00170e38:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_148);
        }
        local_310 = &local_300;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_300 = *puVar13;
          uStack_2f8 = puVar11[3];
        }
        else {
          local_300 = *puVar13;
          local_310 = (ulong *)*puVar11;
        }
        local_308 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
        local_520 = &local_510;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_510 = *puVar13;
          lStack_508 = puVar11[3];
        }
        else {
          local_510 = *puVar13;
          local_520 = (ulong *)*puVar11;
        }
        local_518 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_600)
        ;
        local_3a0 = &local_390;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_390 = *puVar13;
          lStack_388 = puVar11[3];
        }
        else {
          local_390 = *puVar13;
          local_3a0 = (ulong *)*puVar11;
        }
        local_398 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
        local_3c0 = &local_3b0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_3b0 = *puVar13;
          lStack_3a8 = puVar11[3];
        }
        else {
          local_3b0 = *puVar13;
          local_3c0 = (ulong *)*puVar11;
        }
        local_3b8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_600)
        ;
        local_358 = &local_348;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_348 = *puVar13;
          lStack_340 = puVar11[3];
        }
        else {
          local_348 = *puVar13;
          local_358 = (ulong *)*puVar11;
        }
        local_350 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_358);
        local_480 = &local_470;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_470 = *puVar13;
          lStack_468 = puVar11[3];
        }
        else {
          local_470 = *puVar13;
          local_480 = (ulong *)*puVar11;
        }
        local_478 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_168 = local_158;
        std::__cxx11::string::_M_construct((ulong)&local_168,'\t');
        uVar21 = 0xf;
        if (local_480 != &local_470) {
          uVar21 = local_470;
        }
        if (uVar21 < (ulong)(local_160 + local_478)) {
          uVar21 = 0xf;
          if (local_168 != local_158) {
            uVar21 = local_158[0];
          }
          if (uVar21 < (ulong)(local_160 + local_478)) goto LAB_00171157;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_480);
        }
        else {
LAB_00171157:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_168);
        }
        local_560 = &local_550;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_550 = *puVar13;
          lStack_548 = puVar11[3];
        }
        else {
          local_550 = *puVar13;
          local_560 = (ulong *)*puVar11;
        }
        local_558 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_560);
        local_400 = &local_3f0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_3f0 = *puVar13;
          lStack_3e8 = puVar11[3];
        }
        else {
          local_3f0 = *puVar13;
          local_400 = (ulong *)*puVar11;
        }
        local_3f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_188 = local_178;
        std::__cxx11::string::_M_construct((ulong)&local_188,'\f');
        uVar21 = 0xf;
        if (local_400 != &local_3f0) {
          uVar21 = local_3f0;
        }
        if (uVar21 < (ulong)(local_180 + local_3f8)) {
          uVar21 = 0xf;
          if (local_188 != local_178) {
            uVar21 = local_178[0];
          }
          if (uVar21 < (ulong)(local_180 + local_3f8)) goto LAB_001712c0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_400);
        }
        else {
LAB_001712c0:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_188);
        }
        local_4e0 = &local_4d0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_4d0 = *puVar13;
          lStack_4c8 = puVar11[3];
        }
        else {
          local_4d0 = *puVar13;
          local_4e0 = (ulong *)*puVar11;
        }
        local_4d8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
        local_3e0 = &local_3d0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_3d0 = *puVar13;
          lStack_3c8 = puVar11[3];
        }
        else {
          local_3d0 = *puVar13;
          local_3e0 = (ulong *)*puVar11;
        }
        local_3d8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_1a8 = local_198;
        std::__cxx11::string::_M_construct((ulong)&local_1a8,'\f');
        uVar21 = 0xf;
        if (local_3e0 != &local_3d0) {
          uVar21 = local_3d0;
        }
        if (uVar21 < (ulong)(local_1a0 + local_3d8)) {
          uVar21 = 0xf;
          if (local_1a8 != local_198) {
            uVar21 = local_198[0];
          }
          if (uVar21 < (ulong)(local_1a0 + local_3d8)) goto LAB_00171429;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_3e0);
        }
        else {
LAB_00171429:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_1a8);
        }
        local_460 = &local_450;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_450 = *puVar13;
          lStack_448 = puVar11[3];
        }
        else {
          local_450 = *puVar13;
          local_460 = (ulong *)*puVar11;
        }
        local_458 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
        local_620 = &local_610;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_610 = *puVar13;
          lStack_608 = puVar11[3];
        }
        else {
          local_610 = *puVar13;
          local_620 = (ulong *)*puVar11;
        }
        local_618 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_1c8 = local_1b8;
        std::__cxx11::string::_M_construct((ulong)&local_1c8,'\t');
        uVar21 = 0xf;
        if (local_620 != &local_610) {
          uVar21 = local_610;
        }
        if (uVar21 < (ulong)(local_1c0 + local_618)) {
          uVar21 = 0xf;
          if (local_1c8 != local_1b8) {
            uVar21 = local_1b8[0];
          }
          if (uVar21 < (ulong)(local_1c0 + local_618)) goto LAB_00171592;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_620);
        }
        else {
LAB_00171592:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_1c8);
        }
        local_6a0 = &local_690;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_690 = *puVar13;
          lStack_688 = puVar11[3];
        }
        else {
          local_690 = *puVar13;
          local_6a0 = (ulong *)*puVar11;
        }
        local_698 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_6a0);
        local_6e0 = &local_6d0;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_6d0 = *puVar13;
          lStack_6c8 = plVar10[3];
        }
        else {
          local_6d0 = *puVar13;
          local_6e0 = (ulong *)*plVar10;
        }
        local_6d8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_1e8 = local_1d8;
        std::__cxx11::string::_M_construct((ulong)&local_1e8,'\t');
        uVar21 = 0xf;
        if (local_6e0 != &local_6d0) {
          uVar21 = local_6d0;
        }
        if (uVar21 < (ulong)(local_1e0 + local_6d8)) {
          uVar21 = 0xf;
          if (local_1e8 != local_1d8) {
            uVar21 = local_1d8[0];
          }
          if (uVar21 < (ulong)(local_1e0 + local_6d8)) goto LAB_001716fb;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_6e0);
        }
        else {
LAB_001716fb:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)local_1e8);
        }
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_740.field_2._M_allocated_capacity = *puVar13;
          local_740.field_2._8_8_ = puVar11[3];
        }
        else {
          local_740.field_2._M_allocated_capacity = *puVar13;
          local_740._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_740._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_740);
        local_720 = &local_710;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_710 = *puVar13;
          lStack_708 = puVar11[3];
        }
        else {
          local_710 = *puVar13;
          local_720 = (ulong *)*puVar11;
        }
        local_718 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_f8 = local_e8;
        std::__cxx11::string::_M_construct((ulong)&local_f8,'\f');
        uVar21 = 0xf;
        if (local_720 != &local_710) {
          uVar21 = local_710;
        }
        if (uVar21 < (ulong)(local_f0 + local_718)) {
          uVar21 = 0xf;
          if (local_f8 != local_e8) {
            uVar21 = local_e8[0];
          }
          if (uVar21 < (ulong)(local_f0 + local_718)) goto LAB_00171864;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_720);
        }
        else {
LAB_00171864:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_720,(ulong)local_f8);
        }
        local_7a0 = &local_790;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_790 = *puVar13;
          lStack_788 = puVar11[3];
        }
        else {
          local_790 = *puVar13;
          local_7a0 = (ulong *)*puVar11;
        }
        local_798 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7a0);
        local_700 = &local_6f0;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_6f0 = *puVar13;
          lStack_6e8 = plVar10[3];
        }
        else {
          local_6f0 = *puVar13;
          local_700 = (ulong *)*plVar10;
        }
        local_6f8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_700,(ulong)local_600);
        local_7c0 = &local_7b0;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_7b0 = *puVar13;
          lStack_7a8 = plVar10[3];
        }
        else {
          local_7b0 = *puVar13;
          local_7c0 = (ulong *)*plVar10;
        }
        local_7b8 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_810 = *puVar13;
          lStack_808 = plVar10[3];
        }
        else {
          local_810 = *puVar13;
          local_820 = (ulong *)*plVar10;
        }
        local_818 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_90 = local_80;
        std::__cxx11::string::_M_construct((ulong)&local_90,'\t');
        uVar21 = 0xf;
        if (local_820 != &local_810) {
          uVar21 = local_810;
        }
        if (uVar21 < (ulong)(local_88 + local_818)) {
          uVar21 = 0xf;
          if (local_90 != local_80) {
            uVar21 = local_80[0];
          }
          if (uVar21 < (ulong)(local_88 + local_818)) goto LAB_00171a8d;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_820);
        }
        else {
LAB_00171a8d:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_90);
        }
        local_800 = &local_7f0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7f0 = *puVar13;
          lStack_7e8 = puVar11[3];
        }
        else {
          local_7f0 = *puVar13;
          local_800 = (ulong *)*puVar11;
        }
        local_7f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_800);
        local_840 = &local_830;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_830 = *puVar13;
          lStack_828 = plVar10[3];
        }
        else {
          local_830 = *puVar13;
          local_840 = (ulong *)*plVar10;
        }
        local_838 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_840,
                                     (ulong)((local_d0.
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(long)puVar22].
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p);
        local_860 = &local_850;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_850 = *puVar13;
          lStack_848 = plVar10[3];
        }
        else {
          local_850 = *puVar13;
          local_860 = (ulong *)*plVar10;
        }
        local_858 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct((ulong)&local_b0,'\x06');
        uVar21 = 0xf;
        if (local_860 != &local_850) {
          uVar21 = local_850;
        }
        if (uVar21 < (ulong)(local_a8 + local_858)) {
          uVar21 = 0xf;
          if (local_b0 != local_a0) {
            uVar21 = local_a0[0];
          }
          if (uVar21 < (ulong)(local_a8 + local_858)) goto LAB_00171c27;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_860);
        }
        else {
LAB_00171c27:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_b0);
        }
        local_7e0 = &local_7d0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7d0 = *puVar13;
          lStack_7c8 = puVar11[3];
        }
        else {
          local_7d0 = *puVar13;
          local_7e0 = (ulong *)*puVar11;
        }
        local_7d8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_750 = *puVar13;
          lStack_748 = puVar11[3];
          local_760 = &local_750;
        }
        else {
          local_750 = *puVar13;
          local_760 = (ulong *)*puVar11;
        }
        local_758 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_760);
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_f8 != local_e8) {
          operator_delete(local_f8);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8);
        }
        if (local_620 != &local_610) {
          operator_delete(local_620);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_1a8 != local_198) {
          operator_delete(local_1a8);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0);
        }
        if (local_188 != local_178) {
          operator_delete(local_188);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_560 != &local_550) {
          operator_delete(local_560);
        }
        if (local_168 != local_158) {
          operator_delete(local_168);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_520 != &local_510) {
          operator_delete(local_520);
        }
        if (local_310 != &local_300) {
          operator_delete(local_310);
        }
        if (local_148 != local_138) {
          operator_delete(local_148);
        }
        if (local_540 != &local_530) {
          operator_delete(local_540);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580);
        }
        if (local_128 != local_118) {
          operator_delete(local_128);
        }
        if (local_6c0 != &local_6b0) {
          operator_delete(local_6c0);
        }
        if (local_5a0 != &local_590) {
          operator_delete(local_5a0);
        }
        if (local_420 != &local_410) {
          operator_delete(local_420);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640);
        }
        if (local_660 != &local_650) {
          operator_delete(local_660);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_250 != local_240) {
          operator_delete(local_250);
        }
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if (local_290 != local_280) {
          operator_delete(local_290);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0);
        }
        if (local_270 != local_260) {
          operator_delete(local_270);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0);
        }
        if (local_210 != local_200) {
          operator_delete(local_210);
        }
        local_7a0 = &local_790;
        std::__cxx11::string::_M_construct((ulong)&local_7a0,'\x06');
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7a0);
        local_700 = &local_6f0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_6f0 = *puVar13;
          lStack_6e8 = puVar11[3];
        }
        else {
          local_6f0 = *puVar13;
          local_700 = (ulong *)*puVar11;
        }
        local_6f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        cVar23 = '\x01';
        if ((ulong *)0x9 < puVar15) {
          puVar13 = puVar15;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (puVar13 < (ulong *)0x64) {
              cVar23 = cVar23 + -2;
              goto LAB_0017235e;
            }
            if (puVar13 < (ulong *)0x3e8) {
              cVar23 = cVar23 + -1;
              goto LAB_0017235e;
            }
            if (puVar13 < (ulong *)0x2710) goto LAB_0017235e;
            bVar8 = (ulong *)0x1869f < puVar13;
            puVar13 = (ulong *)((ulong)puVar13 / 10000);
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_0017235e:
        local_720 = &local_710;
        std::__cxx11::string::_M_construct((ulong)&local_720,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_720,(uint)local_718,(unsigned_long)puVar15);
        uVar21 = 0xf;
        if (local_700 != &local_6f0) {
          uVar21 = local_6f0;
        }
        if (uVar21 < (ulong)(local_718 + local_6f8)) {
          uVar21 = 0xf;
          if (local_720 != &local_710) {
            uVar21 = local_710;
          }
          if (uVar21 < (ulong)(local_718 + local_6f8)) goto LAB_001723f8;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_720,0,(char *)0x0,(ulong)local_700);
        }
        else {
LAB_001723f8:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_700,(ulong)local_720);
        }
        local_7c0 = &local_7b0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7b0 = *puVar13;
          lStack_7a8 = puVar11[3];
        }
        else {
          local_7b0 = *puVar13;
          local_7c0 = (ulong *)*puVar11;
        }
        local_7b8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_810 = *puVar13;
          lStack_808 = puVar11[3];
        }
        else {
          local_810 = *puVar13;
          local_820 = (ulong *)*puVar11;
        }
        local_818 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        cVar23 = '\x01';
        if ((ulong *)0x9 < puVar15) {
          puVar13 = puVar15;
          cVar7 = '\x04';
          do {
            cVar23 = cVar7;
            if (puVar13 < (ulong *)0x64) {
              cVar23 = cVar23 + -2;
              goto LAB_00172523;
            }
            if (puVar13 < (ulong *)0x3e8) {
              cVar23 = cVar23 + -1;
              goto LAB_00172523;
            }
            if (puVar13 < (ulong *)0x2710) goto LAB_00172523;
            bVar8 = (ulong *)0x1869f < puVar13;
            puVar13 = (ulong *)((ulong)puVar13 / 10000);
            cVar7 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_00172523:
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_740,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_740._M_dataplus._M_p,(uint)local_740._M_string_length,
                   (unsigned_long)puVar15);
        uVar21 = 0xf;
        if (local_820 != &local_810) {
          uVar21 = local_810;
        }
        if (uVar21 < local_740._M_string_length + local_818) {
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar24 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_740._M_string_length + local_818) goto LAB_001725b1;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_820);
        }
        else {
LAB_001725b1:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_820,(ulong)local_740._M_dataplus._M_p);
        }
        local_800 = &local_7f0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7f0 = *puVar13;
          lStack_7e8 = puVar11[3];
        }
        else {
          local_7f0 = *puVar13;
          local_800 = (ulong *)*puVar11;
        }
        local_7f8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
        local_840 = &local_830;
        puVar13 = puVar11 + 2;
        local_6e0 = &local_6d0;
        if ((ulong *)*puVar11 == puVar13) {
          local_830 = *puVar13;
          lStack_828 = puVar11[3];
        }
        else {
          local_830 = *puVar13;
          local_840 = (ulong *)*puVar11;
        }
        local_838 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_6e0,'\t');
        uVar21 = 0xf;
        if (local_840 != &local_830) {
          uVar21 = local_830;
        }
        if (uVar21 < (ulong)(local_6d8 + local_838)) {
          uVar21 = 0xf;
          if (local_6e0 != &local_6d0) {
            uVar21 = local_6d0;
          }
          if (uVar21 < (ulong)(local_6d8 + local_838)) goto LAB_001726e8;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6e0,0,(char *)0x0,(ulong)local_840);
        }
        else {
LAB_001726e8:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_6e0);
        }
        local_860 = &local_850;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_850 = *puVar13;
          lStack_848 = puVar11[3];
        }
        else {
          local_850 = *puVar13;
          local_860 = (ulong *)*puVar11;
        }
        local_858 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_860);
        local_7e0 = &local_7d0;
        puVar13 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar13) {
          local_7d0 = *puVar13;
          lStack_7c8 = puVar11[3];
        }
        else {
          local_7d0 = *puVar13;
          local_7e0 = (ulong *)*puVar11;
        }
        local_7d8 = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_7e0,
                             (ulong)((local_70.
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(long)puVar22].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p)
        ;
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_750 = *puVar22;
          lStack_748 = puVar11[3];
          local_760 = &local_750;
        }
        else {
          local_750 = *puVar22;
          local_760 = (ulong *)*puVar11;
        }
        local_758 = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_760);
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
      }
      puVar22 = local_338;
      if (local_600 != &local_5f0) {
        operator_delete(local_600);
        puVar22 = local_338;
      }
    }
    puVar22 = (ulong *)((long)puVar22 + 1);
  }
  local_600 = &local_5f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_600,local_680,local_678 + (long)local_680);
  if (local_5d8 != 0) {
    local_7c0 = &local_7b0;
    std::__cxx11::string::_M_construct((ulong)&local_7c0,'\x06');
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
    local_820 = &local_810;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_810 = *puVar22;
      lStack_808 = puVar11[3];
    }
    else {
      local_810 = *puVar22;
      local_820 = (ulong *)*puVar11;
    }
    local_818 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    cVar23 = '\x01';
    if (9 < local_380) {
      puVar22 = local_380;
      cVar7 = '\x04';
      do {
        cVar23 = cVar7;
        if (puVar22 < 100) {
          cVar23 = cVar23 + -2;
          goto LAB_00172ad2;
        }
        if (puVar22 < 1000) {
          cVar23 = cVar23 + -1;
          goto LAB_00172ad2;
        }
        if (puVar22 < 10000) goto LAB_00172ad2;
        bVar8 = 99999 < puVar22;
        puVar22 = (ulong *)((ulong)puVar22 / 10000);
        cVar7 = cVar23 + '\x04';
      } while (bVar8);
      cVar23 = cVar23 + '\x01';
    }
LAB_00172ad2:
    local_700 = &local_6f0;
    std::__cxx11::string::_M_construct((ulong)&local_700,cVar23);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_700,(uint)local_6f8,(unsigned_long)local_380);
    uVar25 = 0xf;
    if (local_820 != &local_810) {
      uVar25 = local_810;
    }
    if (uVar25 < (ulong)(local_6f8 + local_818)) {
      uVar25 = 0xf;
      if (local_700 != &local_6f0) {
        uVar25 = local_6f0;
      }
      if (uVar25 < (ulong)(local_6f8 + local_818)) goto LAB_00172b58;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,(ulong)local_820);
    }
    else {
LAB_00172b58:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_700);
    }
    local_800 = &local_7f0;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_7f0 = *puVar22;
      lStack_7e8 = puVar11[3];
    }
    else {
      local_7f0 = *puVar22;
      local_800 = (ulong *)*puVar11;
    }
    local_7f8 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)puVar22 = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
    local_840 = &local_830;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_830 = *puVar22;
      lStack_828 = puVar11[3];
    }
    else {
      local_830 = *puVar22;
      local_840 = (ulong *)*puVar11;
    }
    local_838 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    local_7a0 = &local_790;
    std::__cxx11::string::_M_construct((ulong)&local_7a0,'\x06');
    uVar25 = 0xf;
    if (local_840 != &local_830) {
      uVar25 = local_830;
    }
    if (uVar25 < (ulong)(local_798 + local_838)) {
      uVar25 = 0xf;
      if (local_7a0 != &local_790) {
        uVar25 = local_790;
      }
      if (uVar25 < (ulong)(local_798 + local_838)) goto LAB_00172c8c;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_7a0,0,(char *)0x0,(ulong)local_840);
    }
    else {
LAB_00172c8c:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_7a0);
    }
    local_860 = &local_850;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_850 = *puVar22;
      lStack_848 = puVar11[3];
    }
    else {
      local_850 = *puVar22;
      local_860 = (ulong *)*puVar11;
    }
    local_858 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)puVar22 = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_860);
    local_7e0 = &local_7d0;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_7d0 = *puVar22;
      lStack_7c8 = puVar11[3];
    }
    else {
      local_7d0 = *puVar22;
      local_7e0 = (ulong *)*puVar11;
    }
    local_7d8 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7e0,(ulong)local_5e0);
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_750 = *puVar22;
      lStack_748 = puVar11[3];
      local_760 = &local_750;
    }
    else {
      local_750 = *puVar22;
      local_760 = (ulong *)*puVar11;
    }
    local_758 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_760);
    if (local_760 != &local_750) {
      operator_delete(local_760);
    }
    if (local_7e0 != &local_7d0) {
      operator_delete(local_7e0);
    }
    if (local_860 != &local_850) {
      operator_delete(local_860);
    }
    if (local_7a0 != &local_790) {
      operator_delete(local_7a0);
    }
    if (local_840 != &local_830) {
      operator_delete(local_840);
    }
    if (local_800 != &local_7f0) {
      operator_delete(local_800);
    }
    if (local_700 != &local_6f0) {
      operator_delete(local_700);
    }
    if (local_820 != &local_810) {
      operator_delete(local_820);
    }
    if (local_7c0 != &local_7b0) {
      operator_delete(local_7c0);
    }
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct((ulong)&local_230,'\x06');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x2afdd1);
  local_4a0 = &local_490;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_490 = *puVar22;
    lStack_488 = plVar10[3];
  }
  else {
    local_490 = *puVar22;
    local_4a0 = (ulong *)*plVar10;
  }
  local_498 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_2b0 = &local_2a0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_2a0 = *puVar22;
    lStack_298 = plVar10[3];
  }
  else {
    local_2a0 = *puVar22;
    local_2b0 = (ulong *)*plVar10;
  }
  local_2a8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x06');
  uVar25 = 0xf;
  if (local_2b0 != &local_2a0) {
    uVar25 = local_2a0;
  }
  if (uVar25 < (ulong)(local_2c8 + local_2a8)) {
    uVar25 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar25 = local_2c0;
    }
    if (uVar25 < (ulong)(local_2c8 + local_2a8)) goto LAB_00173023;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2b0);
  }
  else {
LAB_00173023:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0);
  }
  local_378 = &local_368;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_368 = *puVar22;
    lStack_360 = puVar11[3];
  }
  else {
    local_368 = *puVar22;
    local_378 = (ulong *)*puVar11;
  }
  local_370 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_378);
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_330.field_2._M_allocated_capacity = *puVar22;
    local_330.field_2._8_8_ = plVar10[3];
  }
  else {
    local_330.field_2._M_allocated_capacity = *puVar22;
    local_330._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_330._M_string_length = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,'\x06');
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    uVar24 = local_330.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar24 < local_2e8 + local_330._M_string_length) {
    uVar25 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar25 = local_2e0;
    }
    if (uVar25 < local_2e8 + local_330._M_string_length) goto LAB_00173187;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2f0,0,(char *)0x0,(ulong)local_330._M_dataplus._M_p);
  }
  else {
LAB_00173187:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2f0);
  }
  local_660 = &local_650;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_650 = *puVar22;
    lStack_648 = puVar11[3];
  }
  else {
    local_650 = *puVar22;
    local_660 = (ulong *)*puVar11;
  }
  local_658 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_660);
  local_640 = &local_630;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_630 = *puVar22;
    lStack_628 = plVar10[3];
  }
  else {
    local_630 = *puVar22;
    local_640 = (ulong *)*plVar10;
  }
  local_638 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_210 = local_200;
  std::__cxx11::string::_M_construct((ulong)&local_210,'\x06');
  uVar25 = CONCAT44(uStack_204,local_208) + local_638;
  uVar21 = 0xf;
  if (local_640 != &local_630) {
    uVar21 = local_630;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_210 != local_200) {
      uVar21 = local_200[0];
    }
    if (uVar21 < uVar25) goto LAB_001732eb;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_640);
  }
  else {
LAB_001732eb:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_640,(ulong)local_210);
  }
  local_440 = &local_430;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_430 = *puVar22;
    lStack_428 = puVar11[3];
  }
  else {
    local_430 = *puVar22;
    local_440 = (ulong *)*puVar11;
  }
  local_438 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_420 = &local_410;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_410 = *puVar22;
    lStack_408 = plVar10[3];
  }
  else {
    local_410 = *puVar22;
    local_420 = (ulong *)*plVar10;
  }
  local_418 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_270 = local_260;
  std::__cxx11::string::_M_construct((ulong)&local_270,'\t');
  uVar25 = CONCAT44(uStack_264,local_268) + local_418;
  uVar21 = 0xf;
  if (local_420 != &local_410) {
    uVar21 = local_410;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_270 != local_260) {
      uVar21 = local_260[0];
    }
    if (uVar21 < uVar25) goto LAB_0017344f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_420);
  }
  else {
LAB_0017344f:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_270);
  }
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_590 = *puVar22;
    lStack_588 = puVar11[3];
    local_5a0 = &local_590;
  }
  else {
    local_590 = *puVar22;
    local_5a0 = (ulong *)*puVar11;
  }
  local_598 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a0);
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_6b0 = *puVar22;
    uStack_6a8 = puVar11[3];
    local_6c0 = &local_6b0;
  }
  else {
    local_6b0 = *puVar22;
    local_6c0 = (ulong *)*puVar11;
  }
  local_6b8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,'\t');
  uVar25 = CONCAT44(uStack_284,local_288) + local_6b8;
  uVar21 = 0xf;
  if (local_6c0 != &local_6b0) {
    uVar21 = local_6b0;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_290 != local_280) {
      uVar21 = local_280[0];
    }
    if (uVar21 < uVar25) goto LAB_0017359c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_6c0);
  }
  else {
LAB_0017359c:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_290);
  }
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_570 = *puVar22;
    uStack_568 = puVar11[3];
    local_580 = &local_570;
  }
  else {
    local_570 = *puVar22;
    local_580 = (ulong *)*puVar11;
  }
  local_578 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_580);
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_530 = *puVar22;
    lStack_528 = puVar11[3];
    local_540 = &local_530;
  }
  else {
    local_530 = *puVar22;
    local_540 = (ulong *)*puVar11;
  }
  local_538 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_250 = local_240;
  std::__cxx11::string::_M_construct((ulong)&local_250,'\f');
  uVar25 = CONCAT44(uStack_244,local_248) + local_538;
  uVar21 = 0xf;
  if (local_540 != &local_530) {
    uVar21 = local_530;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_250 != local_240) {
      uVar21 = local_240[0];
    }
    if (uVar21 < uVar25) goto LAB_001736eb;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_540);
  }
  else {
LAB_001736eb:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_250);
  }
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_300 = *puVar22;
    uStack_2f8 = puVar11[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar22;
    local_310 = (ulong *)*puVar11;
  }
  local_308 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_520 = &local_510;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_510 = *puVar22;
    lStack_508 = plVar10[3];
  }
  else {
    local_510 = *puVar22;
    local_520 = (ulong *)*plVar10;
  }
  local_518 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_128 = local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\f');
  uVar25 = 0xf;
  if (local_520 != &local_510) {
    uVar25 = local_510;
  }
  if (uVar25 < (ulong)(local_120 + local_518)) {
    uVar25 = 0xf;
    if (local_128 != local_118) {
      uVar25 = local_118[0];
    }
    if (uVar25 < (ulong)(local_120 + local_518)) goto LAB_00173849;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_520);
  }
  else {
LAB_00173849:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_128);
  }
  local_3a0 = &local_390;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_390 = *puVar22;
    lStack_388 = puVar11[3];
  }
  else {
    local_390 = *puVar22;
    local_3a0 = (ulong *)*puVar11;
  }
  local_398 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  local_3c0 = &local_3b0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_3b0 = *puVar22;
    lStack_3a8 = plVar10[3];
  }
  else {
    local_3b0 = *puVar22;
    local_3c0 = (ulong *)*plVar10;
  }
  local_3b8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_148 = local_138;
  std::__cxx11::string::_M_construct((ulong)&local_148,'\t');
  uVar25 = 0xf;
  if (local_3c0 != &local_3b0) {
    uVar25 = local_3b0;
  }
  if (uVar25 < (ulong)(local_140 + local_3b8)) {
    uVar25 = 0xf;
    if (local_148 != local_138) {
      uVar25 = local_138[0];
    }
    if (uVar25 < (ulong)(local_140 + local_3b8)) goto LAB_001739ad;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_3c0);
  }
  else {
LAB_001739ad:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_148);
  }
  local_358 = &local_348;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_348 = *puVar22;
    lStack_340 = puVar11[3];
  }
  else {
    local_348 = *puVar22;
    local_358 = (ulong *)*puVar11;
  }
  local_350 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_358);
  local_480 = &local_470;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_470 = *puVar22;
    lStack_468 = plVar10[3];
  }
  else {
    local_470 = *puVar22;
    local_480 = (ulong *)*plVar10;
  }
  local_478 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_168 = local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,'\x06');
  uVar25 = 0xf;
  if (local_480 != &local_470) {
    uVar25 = local_470;
  }
  if (uVar25 < (ulong)(local_160 + local_478)) {
    uVar25 = 0xf;
    if (local_168 != local_158) {
      uVar25 = local_158[0];
    }
    if (uVar25 < (ulong)(local_160 + local_478)) goto LAB_00173b11;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_480);
  }
  else {
LAB_00173b11:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_168);
  }
  local_560 = &local_550;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_550 = *puVar22;
    lStack_548 = puVar11[3];
  }
  else {
    local_550 = *puVar22;
    local_560 = (ulong *)*puVar11;
  }
  local_558 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_560);
  local_400 = &local_3f0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_3f0 = *puVar22;
    lStack_3e8 = plVar10[3];
  }
  else {
    local_3f0 = *puVar22;
    local_400 = (ulong *)*plVar10;
  }
  local_3f8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_188 = local_178;
  std::__cxx11::string::_M_construct((ulong)&local_188,'\x06');
  uVar25 = 0xf;
  if (local_400 != &local_3f0) {
    uVar25 = local_3f0;
  }
  if (uVar25 < (ulong)(local_180 + local_3f8)) {
    uVar25 = 0xf;
    if (local_188 != local_178) {
      uVar25 = local_178[0];
    }
    if (uVar25 < (ulong)(local_180 + local_3f8)) goto LAB_00173c75;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_400);
  }
  else {
LAB_00173c75:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_188);
  }
  local_4e0 = &local_4d0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_4d0 = *puVar22;
    lStack_4c8 = puVar11[3];
  }
  else {
    local_4d0 = *puVar22;
    local_4e0 = (ulong *)*puVar11;
  }
  local_4d8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_3e0 = &local_3d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_3d0 = *puVar22;
    lStack_3c8 = plVar10[3];
  }
  else {
    local_3d0 = *puVar22;
    local_3e0 = (ulong *)*plVar10;
  }
  local_3d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_460 = &local_450;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_450 = *puVar22;
    lStack_448 = plVar10[3];
  }
  else {
    local_450 = *puVar22;
    local_460 = (ulong *)*plVar10;
  }
  local_458 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_620 = &local_610;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_610 = *puVar22;
    lStack_608 = plVar10[3];
  }
  else {
    local_610 = *puVar22;
    local_620 = (ulong *)*plVar10;
  }
  local_618 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,'\x06');
  uVar25 = 0xf;
  if (local_620 != &local_610) {
    uVar25 = local_610;
  }
  if (uVar25 < (ulong)(local_1a0 + local_618)) {
    uVar25 = 0xf;
    if (local_1a8 != local_198) {
      uVar25 = local_198[0];
    }
    if (uVar25 < (ulong)(local_1a0 + local_618)) goto LAB_00173ea3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_620);
  }
  else {
LAB_00173ea3:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_1a8);
  }
  local_6a0 = &local_690;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_690 = *puVar22;
    lStack_688 = puVar11[3];
  }
  else {
    local_690 = *puVar22;
    local_6a0 = (ulong *)*puVar11;
  }
  local_698 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_6a0);
  local_6e0 = &local_6d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_6d0 = *puVar22;
    lStack_6c8 = plVar10[3];
  }
  else {
    local_6d0 = *puVar22;
    local_6e0 = (ulong *)*plVar10;
  }
  local_6d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,'\x06');
  uVar25 = 0xf;
  if (local_6e0 != &local_6d0) {
    uVar25 = local_6d0;
  }
  if (uVar25 < (ulong)(local_1c0 + local_6d8)) {
    uVar25 = 0xf;
    if (local_1c8 != local_1b8) {
      uVar25 = local_1b8[0];
    }
    if (uVar25 < (ulong)(local_1c0 + local_6d8)) goto LAB_00174007;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_6e0);
  }
  else {
LAB_00174007:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)local_1c8);
  }
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  psVar17 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_740.field_2._M_allocated_capacity = *psVar17;
    local_740.field_2._8_8_ = puVar11[3];
  }
  else {
    local_740.field_2._M_allocated_capacity = *psVar17;
    local_740._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_740._M_string_length = puVar11[1];
  *puVar11 = psVar17;
  puVar11[1] = 0;
  *(undefined1 *)psVar17 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_740);
  local_720 = &local_710;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_710 = *puVar22;
    lStack_708 = plVar10[3];
  }
  else {
    local_710 = *puVar22;
    local_720 = (ulong *)*plVar10;
  }
  local_718 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_720);
  local_7a0 = &local_790;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_790 = *puVar22;
    lStack_788 = plVar10[3];
  }
  else {
    local_790 = *puVar22;
    local_7a0 = (ulong *)*plVar10;
  }
  local_798 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_7a0);
  local_700 = &local_6f0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_6f0 = *puVar22;
    lStack_6e8 = plVar10[3];
  }
  else {
    local_6f0 = *puVar22;
    local_700 = (ulong *)*plVar10;
  }
  local_6f8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_700);
  local_7c0 = &local_7b0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_7b0 = *puVar22;
    lStack_7a8 = plVar10[3];
  }
  else {
    local_7b0 = *puVar22;
    local_7c0 = (ulong *)*plVar10;
  }
  local_7b8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_7c0);
  local_820 = &local_810;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_810 = *puVar22;
    lStack_808 = plVar10[3];
  }
  else {
    local_810 = *puVar22;
    local_820 = (ulong *)*plVar10;
  }
  local_818 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_820);
  local_800 = &local_7f0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_7f0 = *puVar22;
    lStack_7e8 = plVar10[3];
  }
  else {
    local_7f0 = *puVar22;
    local_800 = (ulong *)*plVar10;
  }
  local_7f8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
  local_840 = &local_830;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_830 = *puVar22;
    lStack_828 = puVar11[3];
  }
  else {
    local_830 = *puVar22;
    local_840 = (ulong *)*puVar11;
  }
  local_838 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_840);
  local_860 = &local_850;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_850 = *puVar22;
    lStack_848 = plVar10[3];
  }
  else {
    local_850 = *puVar22;
    local_860 = (ulong *)*plVar10;
  }
  local_858 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x06');
  uVar25 = 0xf;
  if (local_860 != &local_850) {
    uVar25 = local_850;
  }
  if (uVar25 < (ulong)(local_1e0 + local_858)) {
    uVar25 = 0xf;
    if (local_1e8 != local_1d8) {
      uVar25 = local_1d8[0];
    }
    if (uVar25 < (ulong)(local_1e0 + local_858)) goto LAB_001743e6;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_860);
  }
  else {
LAB_001743e6:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_1e8);
  }
  local_7e0 = &local_7d0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_7d0 = *puVar22;
    lStack_7c8 = puVar11[3];
  }
  else {
    local_7d0 = *puVar22;
    local_7e0 = (ulong *)*puVar11;
  }
  local_7d8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_750 = *puVar22;
    lStack_748 = puVar11[3];
    local_760 = &local_750;
  }
  else {
    local_750 = *puVar22;
    local_760 = (ulong *)*puVar11;
  }
  local_758 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_760);
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_6e0 != &local_6d0) {
    operator_delete(local_6e0);
  }
  if (local_6a0 != &local_690) {
    operator_delete(local_6a0);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  local_760 = &local_750;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_760,local_500,local_4f8 + (long)local_500);
  if (local_4b8 != 0) {
    local_820 = &local_810;
    std::__cxx11::string::_M_construct((ulong)&local_820,'\x06');
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_820);
    local_800 = &local_7f0;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_7f0 = *puVar22;
      lStack_7e8 = puVar11[3];
    }
    else {
      local_7f0 = *puVar22;
      local_800 = (ulong *)*puVar11;
    }
    local_7f8 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    cVar23 = '\x01';
    if (9 < local_380) {
      puVar22 = local_380;
      cVar7 = '\x04';
      do {
        cVar23 = cVar7;
        if (puVar22 < 100) {
          cVar23 = cVar23 + -2;
          goto LAB_00174ad8;
        }
        if (puVar22 < 1000) {
          cVar23 = cVar23 + -1;
          goto LAB_00174ad8;
        }
        if (puVar22 < 10000) goto LAB_00174ad8;
        bVar8 = 99999 < puVar22;
        puVar22 = (ulong *)((ulong)puVar22 / 10000);
        cVar7 = cVar23 + '\x04';
      } while (bVar8);
      cVar23 = cVar23 + '\x01';
    }
LAB_00174ad8:
    local_7c0 = &local_7b0;
    std::__cxx11::string::_M_construct((ulong)&local_7c0,cVar23);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_7c0,(uint)local_7b8,(unsigned_long)local_380);
    uVar25 = 0xf;
    if (local_800 != &local_7f0) {
      uVar25 = local_7f0;
    }
    if (uVar25 < (ulong)(local_7b8 + local_7f8)) {
      uVar25 = 0xf;
      if (local_7c0 != &local_7b0) {
        uVar25 = local_7b0;
      }
      if (uVar25 < (ulong)(local_7b8 + local_7f8)) goto LAB_00174b5e;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_7c0,0,(char *)0x0,(ulong)local_800);
    }
    else {
LAB_00174b5e:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_7c0);
    }
    local_840 = &local_830;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_830 = *puVar22;
      lStack_828 = puVar11[3];
    }
    else {
      local_830 = *puVar22;
      local_840 = (ulong *)*puVar11;
    }
    local_838 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)puVar22 = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_840);
    local_860 = &local_850;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_850 = *puVar22;
      lStack_848 = puVar11[3];
    }
    else {
      local_850 = *puVar22;
      local_860 = (ulong *)*puVar11;
    }
    local_858 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_4c0);
    local_7e0 = &local_7d0;
    puVar22 = puVar11 + 2;
    if ((ulong *)*puVar11 == puVar22) {
      local_7d0 = *puVar22;
      lStack_7c8 = puVar11[3];
    }
    else {
      local_7d0 = *puVar22;
      local_7e0 = (ulong *)*puVar11;
    }
    local_7d8 = puVar11[1];
    *puVar11 = puVar22;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_760,(ulong)local_7e0);
    if (local_7e0 != &local_7d0) {
      operator_delete(local_7e0);
    }
    if (local_860 != &local_850) {
      operator_delete(local_860);
    }
    if (local_840 != &local_830) {
      operator_delete(local_840);
    }
    if (local_7c0 != &local_7b0) {
      operator_delete(local_7c0);
    }
    if (local_800 != &local_7f0) {
      operator_delete(local_800);
    }
    if (local_820 != &local_810) {
      operator_delete(local_820);
    }
  }
  local_2b0 = &local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,'\x03');
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_378 = &local_368;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_368 = *puVar22;
    lStack_360 = plVar10[3];
  }
  else {
    local_368 = *puVar22;
    local_378 = (ulong *)*plVar10;
  }
  local_370 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_4a0 = &local_490;
  std::__cxx11::string::_M_construct((ulong)&local_4a0,'\x03');
  uVar25 = 0xf;
  if (local_378 != &local_368) {
    uVar25 = local_368;
  }
  if (uVar25 < (ulong)(local_498 + local_370)) {
    uVar25 = 0xf;
    if (local_4a0 != &local_490) {
      uVar25 = local_490;
    }
    if (uVar25 < (ulong)(local_498 + local_370)) goto LAB_00174e38;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,(ulong)local_378);
  }
  else {
LAB_00174e38:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_4a0);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  puVar22 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_330.field_2._M_allocated_capacity = *puVar22;
    local_330.field_2._8_8_ = puVar11[3];
  }
  else {
    local_330.field_2._M_allocated_capacity = *puVar22;
    local_330._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_330._M_string_length = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_330);
  local_660 = &local_650;
  puVar22 = (ulong *)(plVar10 + 2);
  local_230 = &local_220;
  if ((ulong *)*plVar10 == puVar22) {
    local_650 = *puVar22;
    lStack_648 = plVar10[3];
  }
  else {
    local_650 = *puVar22;
    local_660 = (ulong *)*plVar10;
  }
  local_658 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_construct((ulong)&local_230,'\x06');
  uVar25 = 0xf;
  if (local_660 != &local_650) {
    uVar25 = local_650;
  }
  if (uVar25 < (ulong)(local_228 + local_658)) {
    uVar25 = 0xf;
    if (local_230 != &local_220) {
      uVar25 = local_220;
    }
    if (uVar25 < (ulong)(local_228 + local_658)) goto LAB_00174f9c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_660);
  }
  else {
LAB_00174f9c:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_230);
  }
  local_640 = &local_630;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_630 = *puVar22;
    lStack_628 = puVar11[3];
  }
  else {
    local_630 = *puVar22;
    local_640 = (ulong *)*puVar11;
  }
  local_638 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_640);
  local_440 = &local_430;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_430 = *puVar22;
    lStack_428 = plVar10[3];
  }
  else {
    local_430 = *puVar22;
    local_440 = (ulong *)*plVar10;
  }
  local_438 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x06');
  uVar25 = 0xf;
  if (local_440 != &local_430) {
    uVar25 = local_430;
  }
  if (uVar25 < (ulong)(local_2c8 + local_438)) {
    uVar25 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar25 = local_2c0;
    }
    if (uVar25 < (ulong)(local_2c8 + local_438)) goto LAB_00175100;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_00175100:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_2d0);
  }
  local_420 = &local_410;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_410 = *puVar22;
    lStack_408 = puVar11[3];
  }
  else {
    local_410 = *puVar22;
    local_420 = (ulong *)*puVar11;
  }
  local_418 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_420);
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_590 = *puVar22;
    lStack_588 = puVar11[3];
    local_5a0 = &local_590;
  }
  else {
    local_590 = *puVar22;
    local_5a0 = (ulong *)*puVar11;
  }
  local_598 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,'\x06');
  uVar25 = 0xf;
  if (local_5a0 != &local_590) {
    uVar25 = local_590;
  }
  if (uVar25 < (ulong)(local_2e8 + local_598)) {
    uVar25 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar25 = local_2e0;
    }
    if (uVar25 < (ulong)(local_2e8 + local_598)) goto LAB_00175255;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_5a0);
  }
  else {
LAB_00175255:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_2f0);
  }
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_6b0 = *puVar22;
    uStack_6a8 = puVar11[3];
    local_6c0 = &local_6b0;
  }
  else {
    local_6b0 = *puVar22;
    local_6c0 = (ulong *)*puVar11;
  }
  local_6b8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_6c0);
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_570 = *puVar22;
    uStack_568 = puVar11[3];
    local_580 = &local_570;
  }
  else {
    local_570 = *puVar22;
    local_580 = (ulong *)*puVar11;
  }
  local_578 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_210 = local_200;
  std::__cxx11::string::_M_construct((ulong)&local_210,'\x06');
  uVar25 = CONCAT44(uStack_204,local_208) + local_578;
  uVar21 = 0xf;
  if (local_580 != &local_570) {
    uVar21 = local_570;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_210 != local_200) {
      uVar21 = local_200[0];
    }
    if (uVar21 < uVar25) goto LAB_001753a3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_580);
  }
  else {
LAB_001753a3:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_580,(ulong)local_210);
  }
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_530 = *puVar22;
    lStack_528 = puVar11[3];
    local_540 = &local_530;
  }
  else {
    local_530 = *puVar22;
    local_540 = (ulong *)*puVar11;
  }
  local_538 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_540);
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_300 = *puVar22;
    uStack_2f8 = puVar11[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar22;
    local_310 = (ulong *)*puVar11;
  }
  local_308 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_270 = local_260;
  std::__cxx11::string::_M_construct((ulong)&local_270,'\x06');
  uVar25 = CONCAT44(uStack_264,local_268) + local_308;
  uVar21 = 0xf;
  if (local_310 != &local_300) {
    uVar21 = local_300;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_270 != local_260) {
      uVar21 = local_260[0];
    }
    if (uVar21 < uVar25) goto LAB_001754f2;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_001754f2:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_270);
  }
  local_520 = &local_510;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_510 = *puVar22;
    lStack_508 = puVar11[3];
  }
  else {
    local_510 = *puVar22;
    local_520 = (ulong *)*puVar11;
  }
  local_518 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
  local_3a0 = &local_390;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_390 = *puVar22;
    lStack_388 = plVar10[3];
  }
  else {
    local_390 = *puVar22;
    local_3a0 = (ulong *)*plVar10;
  }
  local_398 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,'\x06');
  uVar25 = CONCAT44(uStack_284,local_288) + local_398;
  uVar21 = 0xf;
  if (local_3a0 != &local_390) {
    uVar21 = local_390;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_290 != local_280) {
      uVar21 = local_280[0];
    }
    if (uVar21 < uVar25) goto LAB_00175656;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_3a0);
  }
  else {
LAB_00175656:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_290);
  }
  local_3c0 = &local_3b0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_3b0 = *puVar22;
    lStack_3a8 = puVar11[3];
  }
  else {
    local_3b0 = *puVar22;
    local_3c0 = (ulong *)*puVar11;
  }
  local_3b8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  local_358 = &local_348;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_348 = *puVar22;
    lStack_340 = plVar10[3];
  }
  else {
    local_348 = *puVar22;
    local_358 = (ulong *)*plVar10;
  }
  local_350 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_358);
  local_480 = &local_470;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_470 = *puVar22;
    lStack_468 = plVar10[3];
  }
  else {
    local_470 = *puVar22;
    local_480 = (ulong *)*plVar10;
  }
  local_478 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_250 = local_240;
  std::__cxx11::string::_M_construct((ulong)&local_250,'\x06');
  uVar25 = CONCAT44(uStack_244,local_248) + local_478;
  uVar21 = 0xf;
  if (local_480 != &local_470) {
    uVar21 = local_470;
  }
  if (uVar21 < uVar25) {
    uVar21 = 0xf;
    if (local_250 != local_240) {
      uVar21 = local_240[0];
    }
    if (uVar21 < uVar25) goto LAB_0017581f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_480);
  }
  else {
LAB_0017581f:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_250);
  }
  local_560 = &local_550;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_550 = *puVar22;
    lStack_548 = puVar11[3];
  }
  else {
    local_550 = *puVar22;
    local_560 = (ulong *)*puVar11;
  }
  local_558 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_560);
  local_400 = &local_3f0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_3f0 = *puVar22;
    lStack_3e8 = plVar10[3];
  }
  else {
    local_3f0 = *puVar22;
    local_400 = (ulong *)*plVar10;
  }
  local_3f8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_128 = local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x06');
  uVar25 = 0xf;
  if (local_400 != &local_3f0) {
    uVar25 = local_3f0;
  }
  if (uVar25 < (ulong)(local_120 + local_3f8)) {
    uVar25 = 0xf;
    if (local_128 != local_118) {
      uVar25 = local_118[0];
    }
    if (uVar25 < (ulong)(local_120 + local_3f8)) goto LAB_00175983;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_400);
  }
  else {
LAB_00175983:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_128);
  }
  local_4e0 = &local_4d0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_4d0 = *puVar22;
    lStack_4c8 = puVar11[3];
  }
  else {
    local_4d0 = *puVar22;
    local_4e0 = (ulong *)*puVar11;
  }
  local_4d8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_3e0 = &local_3d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_3d0 = *puVar22;
    lStack_3c8 = plVar10[3];
  }
  else {
    local_3d0 = *puVar22;
    local_3e0 = (ulong *)*plVar10;
  }
  local_3d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_148 = local_138;
  std::__cxx11::string::_M_construct((ulong)&local_148,'\t');
  uVar25 = 0xf;
  if (local_3e0 != &local_3d0) {
    uVar25 = local_3d0;
  }
  if (uVar25 < (ulong)(local_140 + local_3d8)) {
    uVar25 = 0xf;
    if (local_148 != local_138) {
      uVar25 = local_138[0];
    }
    if (uVar25 < (ulong)(local_140 + local_3d8)) goto LAB_00175ae7;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_3e0);
  }
  else {
LAB_00175ae7:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_148);
  }
  local_460 = &local_450;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_450 = *puVar22;
    lStack_448 = puVar11[3];
  }
  else {
    local_450 = *puVar22;
    local_460 = (ulong *)*puVar11;
  }
  local_458 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_620 = &local_610;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_610 = *puVar22;
    lStack_608 = plVar10[3];
  }
  else {
    local_610 = *puVar22;
    local_620 = (ulong *)*plVar10;
  }
  local_618 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_168 = local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,'\t');
  uVar25 = 0xf;
  if (local_620 != &local_610) {
    uVar25 = local_610;
  }
  if (uVar25 < (ulong)(local_160 + local_618)) {
    uVar25 = 0xf;
    if (local_168 != local_158) {
      uVar25 = local_158[0];
    }
    if (uVar25 < (ulong)(local_160 + local_618)) goto LAB_00175c4b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_620);
  }
  else {
LAB_00175c4b:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_168);
  }
  local_6a0 = &local_690;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_690 = *puVar22;
    lStack_688 = puVar11[3];
  }
  else {
    local_690 = *puVar22;
    local_6a0 = (ulong *)*puVar11;
  }
  local_698 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_6a0);
  local_6e0 = &local_6d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_6d0 = *puVar22;
    lStack_6c8 = plVar10[3];
  }
  else {
    local_6d0 = *puVar22;
    local_6e0 = (ulong *)*plVar10;
  }
  local_6d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_188 = local_178;
  std::__cxx11::string::_M_construct((ulong)&local_188,'\t');
  uVar25 = 0xf;
  if (local_6e0 != &local_6d0) {
    uVar25 = local_6d0;
  }
  if (uVar25 < (ulong)(local_180 + local_6d8)) {
    uVar25 = 0xf;
    if (local_188 != local_178) {
      uVar25 = local_178[0];
    }
    if (uVar25 < (ulong)(local_180 + local_6d8)) goto LAB_00175daf;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_6e0);
  }
  else {
LAB_00175daf:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)local_188);
  }
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  psVar17 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_740.field_2._M_allocated_capacity = *psVar17;
    local_740.field_2._8_8_ = puVar11[3];
  }
  else {
    local_740.field_2._M_allocated_capacity = *psVar17;
    local_740._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_740._M_string_length = puVar11[1];
  *puVar11 = psVar17;
  puVar11[1] = 0;
  *(undefined1 *)psVar17 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_740);
  local_720 = &local_710;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_710 = *puVar22;
    lStack_708 = plVar10[3];
  }
  else {
    local_710 = *puVar22;
    local_720 = (ulong *)*plVar10;
  }
  local_718 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,'\t');
  uVar25 = 0xf;
  if (local_720 != &local_710) {
    uVar25 = local_710;
  }
  if (uVar25 < (ulong)(local_1a0 + local_718)) {
    uVar25 = 0xf;
    if (local_1a8 != local_198) {
      uVar25 = local_198[0];
    }
    if (uVar25 < (ulong)(local_1a0 + local_718)) goto LAB_00175f13;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_720);
  }
  else {
LAB_00175f13:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_720,(ulong)local_1a8);
  }
  local_7a0 = &local_790;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_790 = *puVar22;
    lStack_788 = puVar11[3];
  }
  else {
    local_790 = *puVar22;
    local_7a0 = (ulong *)*puVar11;
  }
  local_798 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_7a0);
  local_700 = &local_6f0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_6f0 = *puVar22;
    lStack_6e8 = plVar10[3];
  }
  else {
    local_6f0 = *puVar22;
    local_700 = (ulong *)*plVar10;
  }
  local_6f8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,'\t');
  uVar25 = 0xf;
  if (local_700 != &local_6f0) {
    uVar25 = local_6f0;
  }
  if (uVar25 < (ulong)(local_1c0 + local_6f8)) {
    uVar25 = 0xf;
    if (local_1c8 != local_1b8) {
      uVar25 = local_1b8[0];
    }
    if (uVar25 < (ulong)(local_1c0 + local_6f8)) goto LAB_00176077;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_700);
  }
  else {
LAB_00176077:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_700,(ulong)local_1c8);
  }
  local_7c0 = &local_7b0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_7b0 = *puVar22;
    lStack_7a8 = puVar11[3];
  }
  else {
    local_7b0 = *puVar22;
    local_7c0 = (ulong *)*puVar11;
  }
  local_7b8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_7c0);
  local_820 = &local_810;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_810 = *puVar22;
    lStack_808 = plVar10[3];
  }
  else {
    local_810 = *puVar22;
    local_820 = (ulong *)*plVar10;
  }
  local_818 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x06');
  uVar25 = 0xf;
  if (local_820 != &local_810) {
    uVar25 = local_810;
  }
  if (uVar25 < (ulong)(local_1e0 + local_818)) {
    uVar25 = 0xf;
    if (local_1e8 != local_1d8) {
      uVar25 = local_1d8[0];
    }
    if (uVar25 < (ulong)(local_1e0 + local_818)) goto LAB_001761c0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_820);
  }
  else {
LAB_001761c0:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_1e8);
  }
  local_800 = &local_7f0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_7f0 = *puVar22;
    lStack_7e8 = puVar11[3];
  }
  else {
    local_7f0 = *puVar22;
    local_800 = (ulong *)*puVar11;
  }
  local_7f8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_800);
  local_840 = &local_830;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_830 = *puVar22;
    lStack_828 = plVar10[3];
  }
  else {
    local_830 = *puVar22;
    local_840 = (ulong *)*plVar10;
  }
  local_838 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
  uVar25 = 0xf;
  if (local_840 != &local_830) {
    uVar25 = local_830;
  }
  if (uVar25 < (ulong)(local_f0 + local_838)) {
    uVar25 = 0xf;
    if (local_f8 != local_e8) {
      uVar25 = local_e8[0];
    }
    if (uVar25 < (ulong)(local_f0 + local_838)) goto LAB_001762f4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_840);
  }
  else {
LAB_001762f4:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_f8);
  }
  local_860 = &local_850;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_850 = *puVar22;
    lStack_848 = puVar11[3];
  }
  else {
    local_850 = *puVar22;
    local_860 = (ulong *)*puVar11;
  }
  local_858 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_860);
  local_7e0 = &local_7d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_7d0 = *puVar22;
    lStack_7c8 = plVar10[3];
  }
  else {
    local_7d0 = *puVar22;
    local_7e0 = (ulong *)*plVar10;
  }
  local_7d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if (local_6e0 != &local_6d0) {
    operator_delete(local_6e0);
  }
  if (local_6a0 != &local_690) {
    operator_delete(local_6a0);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  local_310 = &local_300;
  std::__cxx11::string::_M_construct((ulong)&local_310,'\x03');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_7e0);
  local_520 = &local_510;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_510 = *puVar22;
    lStack_508 = plVar10[3];
  }
  else {
    local_510 = *puVar22;
    local_520 = (ulong *)*plVar10;
  }
  local_518 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
  local_3a0 = &local_390;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_390 = *puVar22;
    lStack_388 = plVar10[3];
  }
  else {
    local_390 = *puVar22;
    local_3a0 = (ulong *)*plVar10;
  }
  local_398 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_540 = &local_530;
  std::__cxx11::string::_M_construct((ulong)&local_540,'\x03');
  uVar25 = 0xf;
  if (local_3a0 != &local_390) {
    uVar25 = local_390;
  }
  if (uVar25 < (ulong)(local_538 + local_398)) {
    uVar25 = 0xf;
    if (local_540 != &local_530) {
      uVar25 = local_530;
    }
    if (uVar25 < (ulong)(local_538 + local_398)) goto LAB_001769fc;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_540,0,(char *)0x0,(ulong)local_3a0);
  }
  else {
LAB_001769fc:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_540);
  }
  local_3c0 = &local_3b0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_3b0 = *puVar22;
    lStack_3a8 = puVar11[3];
  }
  else {
    local_3b0 = *puVar22;
    local_3c0 = (ulong *)*puVar11;
  }
  local_3b8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  local_358 = &local_348;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_348 = *puVar22;
    lStack_340 = plVar10[3];
  }
  else {
    local_348 = *puVar22;
    local_358 = (ulong *)*plVar10;
  }
  local_350 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_580 = &local_570;
  std::__cxx11::string::_M_construct((ulong)&local_580,'\x03');
  uVar25 = 0xf;
  if (local_358 != &local_348) {
    uVar25 = local_348;
  }
  if (uVar25 < (ulong)(local_578 + local_350)) {
    uVar25 = 0xf;
    if (local_580 != &local_570) {
      uVar25 = local_570;
    }
    if (uVar25 < (ulong)(local_578 + local_350)) goto LAB_00176b50;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_580,0,(char *)0x0,(ulong)local_358);
  }
  else {
LAB_00176b50:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_580);
  }
  local_480 = &local_470;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_470 = *puVar22;
    lStack_468 = puVar11[3];
  }
  else {
    local_470 = *puVar22;
    local_480 = (ulong *)*puVar11;
  }
  local_478 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
  local_560 = &local_550;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_550 = *puVar22;
    lStack_548 = plVar10[3];
  }
  else {
    local_550 = *puVar22;
    local_560 = (ulong *)*plVar10;
  }
  local_558 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_6c0 = &local_6b0;
  std::__cxx11::string::_M_construct((ulong)&local_6c0,'\x03');
  uVar25 = 0xf;
  if (local_560 != &local_550) {
    uVar25 = local_550;
  }
  if (uVar25 < (ulong)(local_6b8 + local_558)) {
    uVar25 = 0xf;
    if (local_6c0 != &local_6b0) {
      uVar25 = local_6b0;
    }
    if (uVar25 < (ulong)(local_6b8 + local_558)) goto LAB_00176ca4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_6c0,0,(char *)0x0,(ulong)local_560);
  }
  else {
LAB_00176ca4:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_6c0);
  }
  local_400 = &local_3f0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_3f0 = *puVar22;
    lStack_3e8 = puVar11[3];
  }
  else {
    local_3f0 = *puVar22;
    local_400 = (ulong *)*puVar11;
  }
  local_3f8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_4e0 = &local_4d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_4d0 = *puVar22;
    lStack_4c8 = plVar10[3];
  }
  else {
    local_4d0 = *puVar22;
    local_4e0 = (ulong *)*plVar10;
  }
  local_4d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_5a0 = &local_590;
  std::__cxx11::string::_M_construct((ulong)&local_5a0,'\x03');
  uVar25 = 0xf;
  if (local_4e0 != &local_4d0) {
    uVar25 = local_4d0;
  }
  if (uVar25 < (ulong)(local_598 + local_4d8)) {
    uVar25 = 0xf;
    if (local_5a0 != &local_590) {
      uVar25 = local_590;
    }
    if (uVar25 < (ulong)(local_598 + local_4d8)) goto LAB_00176df8;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5a0,0,(char *)0x0,(ulong)local_4e0);
  }
  else {
LAB_00176df8:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_5a0);
  }
  local_3e0 = &local_3d0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_3d0 = *puVar22;
    lStack_3c8 = puVar11[3];
  }
  else {
    local_3d0 = *puVar22;
    local_3e0 = (ulong *)*puVar11;
  }
  local_3d8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_460 = &local_450;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_450 = *puVar22;
    lStack_448 = plVar10[3];
  }
  else {
    local_450 = *puVar22;
    local_460 = (ulong *)*plVar10;
  }
  local_458 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_460,(ulong)local_5c0._M_dataplus._M_p);
  local_620 = &local_610;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_610 = *puVar22;
    lStack_608 = plVar10[3];
  }
  else {
    local_610 = *puVar22;
    local_620 = (ulong *)*plVar10;
  }
  local_618 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_420 = &local_410;
  std::__cxx11::string::_M_construct((ulong)&local_420,'\x06');
  uVar25 = 0xf;
  if (local_620 != &local_610) {
    uVar25 = local_610;
  }
  if (uVar25 < (ulong)(local_418 + local_618)) {
    uVar25 = 0xf;
    if (local_420 != &local_410) {
      uVar25 = local_410;
    }
    if (uVar25 < (ulong)(local_418 + local_618)) goto LAB_00176fca;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_420,0,(char *)0x0,(ulong)local_620);
  }
  else {
LAB_00176fca:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_420);
  }
  local_6a0 = &local_690;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_690 = *puVar22;
    lStack_688 = puVar11[3];
  }
  else {
    local_690 = *puVar22;
    local_6a0 = (ulong *)*puVar11;
  }
  local_698 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_6a0);
  local_6e0 = &local_6d0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_6d0 = *puVar22;
    lStack_6c8 = plVar10[3];
  }
  else {
    local_6d0 = *puVar22;
    local_6e0 = (ulong *)*plVar10;
  }
  local_6d8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)local_760);
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_740.field_2._M_allocated_capacity = *puVar22;
    local_740.field_2._8_8_ = plVar10[3];
  }
  else {
    local_740.field_2._M_allocated_capacity = *puVar22;
    local_740._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_740._M_string_length = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_440 = &local_430;
  std::__cxx11::string::_M_construct((ulong)&local_440,'\x03');
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    uVar24 = local_740.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar24 < local_438 + local_740._M_string_length) {
    uVar25 = 0xf;
    if (local_440 != &local_430) {
      uVar25 = local_430;
    }
    if (uVar25 < local_438 + local_740._M_string_length) goto LAB_0017719c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_440,0,(char *)0x0,(ulong)local_740._M_dataplus._M_p);
  }
  else {
LAB_0017719c:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_740,(ulong)local_440);
  }
  local_720 = &local_710;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_710 = *puVar22;
    lStack_708 = puVar11[3];
  }
  else {
    local_710 = *puVar22;
    local_720 = (ulong *)*puVar11;
  }
  local_718 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_720);
  local_7a0 = &local_790;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_790 = *puVar22;
    lStack_788 = plVar10[3];
  }
  else {
    local_790 = *puVar22;
    local_7a0 = (ulong *)*plVar10;
  }
  local_798 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_640 = &local_630;
  std::__cxx11::string::_M_construct((ulong)&local_640,'\x03');
  uVar25 = 0xf;
  if (local_7a0 != &local_790) {
    uVar25 = local_790;
  }
  if (uVar25 < (ulong)(local_638 + local_798)) {
    uVar25 = 0xf;
    if (local_640 != &local_630) {
      uVar25 = local_630;
    }
    if (uVar25 < (ulong)(local_638 + local_798)) goto LAB_00177300;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_640,0,(char *)0x0,(ulong)local_7a0);
  }
  else {
LAB_00177300:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7a0,(ulong)local_640);
  }
  local_700 = &local_6f0;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_6f0 = *puVar22;
    lStack_6e8 = puVar11[3];
  }
  else {
    local_6f0 = *puVar22;
    local_700 = (ulong *)*puVar11;
  }
  local_6f8 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_700);
  local_7c0 = &local_7b0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_7b0 = *puVar22;
    lStack_7a8 = plVar10[3];
  }
  else {
    local_7b0 = *puVar22;
    local_7c0 = (ulong *)*plVar10;
  }
  local_7b8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_660 = &local_650;
  std::__cxx11::string::_M_construct((ulong)&local_660,'\x03');
  uVar25 = 0xf;
  if (local_7c0 != &local_7b0) {
    uVar25 = local_7b0;
  }
  if (uVar25 < (ulong)(local_658 + local_7b8)) {
    uVar25 = 0xf;
    if (local_660 != &local_650) {
      uVar25 = local_650;
    }
    if (uVar25 < (ulong)(local_658 + local_7b8)) goto LAB_00177464;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_660,0,(char *)0x0,(ulong)local_7c0);
  }
  else {
LAB_00177464:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_660);
  }
  local_820 = &local_810;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_810 = *puVar22;
    lStack_808 = puVar11[3];
  }
  else {
    local_810 = *puVar22;
    local_820 = (ulong *)*puVar11;
  }
  local_818 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_820);
  local_800 = &local_7f0;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_7f0 = *puVar22;
    lStack_7e8 = plVar10[3];
  }
  else {
    local_7f0 = *puVar22;
    local_800 = (ulong *)*plVar10;
  }
  local_7f8 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_600);
  local_840 = &local_830;
  puVar22 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar22) {
    local_830 = *puVar22;
    lStack_828 = plVar10[3];
  }
  else {
    local_830 = *puVar22;
    local_840 = (ulong *)*plVar10;
  }
  local_838 = plVar10[1];
  *plVar10 = (long)puVar22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_330,'\x03');
  uVar25 = 0xf;
  if (local_840 != &local_830) {
    uVar25 = local_830;
  }
  if (uVar25 < local_330._M_string_length + local_838) {
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      uVar24 = local_330.field_2._M_allocated_capacity;
    }
    if (local_330._M_string_length + local_838 <= (ulong)uVar24) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_840);
      goto LAB_00177617;
    }
  }
  puVar11 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_330._M_dataplus._M_p);
LAB_00177617:
  local_860 = &local_850;
  puVar22 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar22) {
    local_850 = *puVar22;
    lStack_848 = puVar11[3];
  }
  else {
    local_850 = *puVar22;
    local_860 = (ulong *)*puVar11;
  }
  local_858 = puVar11[1];
  *puVar11 = puVar22;
  puVar11[1] = 0;
  *(undefined1 *)puVar22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_860);
  (local_b8->_M_dataplus)._M_p = (pointer)&local_b8->field_2;
  psVar17 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar17) {
    lVar5 = plVar10[3];
    (local_b8->field_2)._M_allocated_capacity = *psVar17;
    *(long *)((long)&local_b8->field_2 + 8) = lVar5;
  }
  else {
    (local_b8->_M_dataplus)._M_p = (pointer)*plVar10;
    (local_b8->field_2)._M_allocated_capacity = *psVar17;
  }
  local_b8->_M_string_length = plVar10[1];
  *plVar10 = (long)psVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  if (local_6e0 != &local_6d0) {
    operator_delete(local_6e0);
  }
  if (local_6a0 != &local_690) {
    operator_delete(local_6a0);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0);
  }
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  if (local_600 != &local_5f0) {
    operator_delete(local_600);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500);
  }
  if (local_5e0 != &local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_d8);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_70);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_d0);
  return local_b8;
}

Assistant:

std::string RegressionTree::genVarianceComputation()
{
    std::vector<std::vector<std::string>> variancePerView(_compiler->numberOfViews());
    //TODO: rename this to thresholdPerView
    std::vector<std::vector<std::string>> functionPerView(_compiler->numberOfViews());
    std::vector<size_t> firstThreshold(NUM_OF_VARIABLES);
    std::vector<Query*> complementQueryPerView(_compiler->numberOfViews());
    
    for (QueryThresholdPair& qtPair : queryToThreshold)
    {
        if (_categoricalFeatures[qtPair.varID])
        {
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            Query* complement = qtPair.complementQuery;
            const size_t& comp_viewID = complement->_aggregates[0]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3)
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& comp_count = complement->_aggregates[0]->_incoming[0].second;
            // const size_t& comp_linear=complement->_aggregates[1]->_incoming[0].second;
            // const size_t& comp_quad = complement->_aggregates[2]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
        
            // variancePerView[viewID].push_back(
            //     "("+viewTup+".aggregates["+std::to_string(count)+"] > 0 ? "+
            //     viewTup+".aggregates["+std::to_string(quad)+"] - ("+
            //     viewTup+".aggregates["+std::to_string(linear)+"] * "+
            //     viewTup+".aggregates["+std::to_string(linear)+"]) / "+
            //     viewTup+".aggregates["+std::to_string(count)+"] : 999);\n"
            //     );
            
            variancePerView[viewID].push_back(
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                "difference[2] - (difference[1] * difference[1]) / difference[0];\n"
                );

            complementQueryPerView[viewID] = complement;
            
            Attribute* att = _td->getAttribute(qtPair.varID);

            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: \"+std::to_string(tuple."+att->_name+")+\" "+
            //     "Operator: = \";\n");

            // TODO:TODO:TODO:TODO:TODO:TODO: WHY DOES THIS SAY AGGREGATES[QUAD] !?!?!
            functionPerView[viewID].push_back(
                ".set("+std::to_string(qtPair.varID)+",tuple."+att->_name+",1,"+
                "&tuple.aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(comp_viewID)+"[0].aggregates["+
                std::to_string(comp_count)+"]"+");\n");
        }
        else
        {   // Continuous variable
            
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            size_t& cviewID = query->_aggregates[3]->_incoming[0].first;
            size_t& cviewID2 = query->_aggregates[4]->_incoming[0].first;
            size_t& cviewID3 = query->_aggregates[5]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3 ||
                cviewID != viewID || cviewID2 != viewID || cviewID3 != viewID  )
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& compcount = query->_aggregates[3]->_incoming[0].second;
            const size_t& complinear = query->_aggregates[4]->_incoming[0].second;
            const size_t& compquad = query->_aggregates[5]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
            
            variancePerView[viewID].push_back(
                "(("+viewTup+".aggregates["+std::to_string(count)+"] > 0  && "+
                viewTup+".aggregates["+std::to_string(compcount)+"] > 0) ? "+
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                viewTup+".aggregates["+std::to_string(compquad)+"] - ("+
                viewTup+".aggregates["+std::to_string(complinear)+"] * "+
                viewTup+".aggregates["+std::to_string(complinear)+"]) / "+
                viewTup+".aggregates["+std::to_string(compcount)+"] : 1.79769e+308);\n"
                );
           
            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: "+std::to_string(qtPair.function->_parameter[0])+" "+
            //     "Operator: < \";\n");
            functionPerView[viewID].push_back(".set("+std::to_string(qtPair.varID)+","+
                std::to_string(qtPair.function->_parameter[0])+",0,"+
                "&V"+std::to_string(viewID)+"[0].aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(cviewID)+"[0].aggregates["+
                std::to_string(compcount)+"]"+");\n");
        }
        
    }

    std::string numOfThresholds = "numberOfThresholds = ";
    size_t numOfContThresholds = 0;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        
        if (!_categoricalFeatures.test(var))
        {
            firstThreshold[var] = numOfContThresholds;
            numOfContThresholds += _thresholds[var].size();
        }
        else
        {
            size_t& viewID = _varToQueryMap[var]->_aggregates[0]->_incoming[0].first;   
            numOfThresholds += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    numOfThresholds += std::to_string(numOfContThresholds)+";\n";

    std::string initVariance = offset(2)+numOfThresholds +
        offset(2)+"variance = new double[numberOfThresholds];\n";
    
    std::string contVariance = "", categVariance = "";
    std::string contFunctionIndex = "", categFunctionIndex = "";
    
    size_t varianceCount = 0;
    for (size_t viewID = 0; viewID < _compiler->numberOfViews(); ++viewID)
    {
        if (!variancePerView[viewID].empty())
        {
            std::string viewString = "V"+std::to_string(viewID);
            
            if (_compiler->getView(viewID)->_fVars.any())
            {
                // categVariance += offset(2)+"for ("+viewString+"_tuple& "+
                //     viewString+"tuple : "+viewString+")\n";
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += offset(3)+
                //         "variance[categIdx++] = "+variancePerView[viewID][j];
                    
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
                
                if (variancePerView[viewID].size() > 1)
                {
                    ERROR("THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
                    exit(1);
                }

                Query* complement = complementQueryPerView[viewID];
                const size_t& comp_viewID =
                    complement->_aggregates[0]->_incoming[0].first;
                const size_t& comp_count =
                    complement->_aggregates[0]->_incoming[0].second;
                const size_t& comp_linear =
                    complement->_aggregates[1]->_incoming[0].second;
                const size_t& comp_quad =
                    complement->_aggregates[2]->_incoming[0].second;

                if (comp_count != comp_linear-1 || comp_count != comp_quad-2 ||
                    comp_linear != comp_quad-1)
                {    
                    ERROR("We should have expected the aggregates to be contiguous!\n");
                    exit(1);
                }

                // std::cout << "complement: " << comp_viewID << "  " << viewID << "\n";
                // std::cout << complement->_fVars << std::endl;
                // std::cout << _compiler->getView(viewID)->_fVars << std::endl;
                
                categVariance += offset(2)+"compaggs = &V"+std::to_string(comp_viewID)+
                    "[0].aggregates["+std::to_string(comp_count)+"];\n"+
                    offset(2)+"for ("+viewString+"_tuple& "+viewString+"tuple : "+
                    viewString+")\n"+offset(2)+"{\n"+
                    offset(3)+"if("+viewString+"tuple.aggregates[0] == 0 || "+
                    viewString+"tuple.aggregates[0] == compaggs[0])\n"+
                    offset(3)+"{\n"+
                    offset(4)+"variance[categIdx++] = 1.79769e+308;\n"+
                    offset(4)+"continue;\n"+
                    offset(3)+"}\n"+
                    offset(3)+"for (size_t i=0; i < 3; ++i)\n"+
                    offset(4)+"difference[i] = compaggs[i] - "+
                    viewString+"tuple.aggregates[i];\n"+
                    offset(3)+"variance[categIdx++] = "+variancePerView[viewID][0]+
                    offset(2)+"}\n";
                
                // categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                //     "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                //     "thresholdMap[categIdx++] = "+functionPerView[viewID][0];
                categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                    "thresholdMap[categIdx++]"+functionPerView[viewID][0];
                
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += "variance[categIdx++] = "+
                //         variancePerView[viewID][0];
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
            }
            else
            {
                contVariance += offset(2)+viewString+"_tuple& "+
                    viewString+"tuple = "+viewString+"[0];\n";
                                
                for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                {
                    contVariance += offset(2)+
                        "variance["+std::to_string(varianceCount)+"] = "+
                        variancePerView[viewID][j];

                    // contFunctionIndex += offset(2)+
                    //     "thresholdMap["+std::to_string(varianceCount)+"] = "+
                    //     functionPerView[viewID][j];
                    contFunctionIndex += offset(2)+
                        "thresholdMap["+std::to_string(varianceCount)+"]"+
                        functionPerView[viewID][j];
                    
                    ++varianceCount;
                }
            }
        }
    }

    std::string computeVariance = contVariance;
    
    if (!categVariance.empty())
    {    
        computeVariance += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+
            offset(2)+"double difference[3], *compaggs;\n"+
            categVariance;
    }
    
    computeVariance += "\n"+offset(2)+"double min_variance = variance[0];\n"+
        offset(2)+"size_t threshold = 0;\n\n"+
        offset(2)+"for (size_t t=1; t < numberOfThresholds; ++t)\n"+offset(2)+"{\n"+
        offset(3)+"if (variance[t] < min_variance)\n"+offset(3)+"{\n"+
        offset(4)+"min_variance = variance[t];\n"+offset(4)+"threshold = t;\n"+
        offset(3)+"}\n"+offset(2)+"}\n"+
        offset(2)+"std::cout << \"The minimum variance is: \" << min_variance <<"+
        "\" for variable \" << thresholdMap[threshold].varID << \" and threshold:"+
        " \" << thresholdMap[threshold].threshold << std::endl;\n"+
        offset(2)+"std::ofstream ofs(\"bestsplit.out\",std::ofstream::out);\n"+
        offset(2)+"ofs << std::fixed << min_variance << \"\\t\" << "+
        "thresholdMap[threshold].varID << \"\\t\" << "+
        "thresholdMap[threshold].threshold  << \"\\t\" << "+
        "thresholdMap[threshold].categorical  << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[0]  << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[1]/thresholdMap[threshold].aggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[1]/thresholdMap[threshold].compAggregates[0] << std::endl;\n"+
        offset(2)+"ofs.close();\n";

    std::string functionIndex = contFunctionIndex;

    if (!categFunctionIndex.empty())
    {
        functionIndex += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+categFunctionIndex;
    }

    std::string thresholdStruct = offset(1)+"struct Threshold\n"+offset(1)+"{\n"+
        offset(2)+"size_t varID;\n"+offset(2)+"double threshold;\n"+
        offset(2)+"bool categorical;\n"+offset(2)+"double* aggregates;\n"+
        offset(2)+"double* compAggregates;\n"+offset(2)+
        "Threshold() : varID(0), threshold(0), categorical(false), "+
        "aggregates(nullptr), compAggregates(nullptr) {}\n"+
        offset(2)+"void set(size_t var, double t, bool c, double* agg, double *cagg)\n"+
        offset(2)+"{\n"+offset(3)+"varID = var;\n"+offset(3)+"threshold = t;\n"+
        offset(3)+"categorical = c;\n"+offset(3)+"aggregates = agg;\n"+
        offset(3)+"compAggregates = cagg;\n"+
        offset(2)+"}\n"+offset(1)+"};\n\n";
    
    return thresholdStruct+
        offset(1)+"size_t numberOfThresholds;\n"+
        offset(1)+"double* variance = nullptr;\n"+
        offset(1)+"Threshold* thresholdMap = nullptr;\n\n"+
        offset(1)+"void initCostArray()\n"+
        offset(1)+"{\n"+initVariance+
        // offset(2)+"thresholdMap = new std::string[numberOfThresholds];\n"+
        offset(2)+"thresholdMap = new Threshold[numberOfThresholds];\n"+
        functionIndex+offset(1)+"}\n\n"+
        offset(1)+"void computeCost()\n"+
        offset(1)+"{\n"+computeVariance+offset(1)+"}\n";    
}